

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

int secp256k1_fe_sqrt(secp256k1_fe *r,secp256k1_fe *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar980 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [16];
  undefined1 auVar990 [16];
  undefined1 auVar991 [16];
  undefined1 auVar992 [16];
  undefined1 auVar993 [16];
  undefined1 auVar994 [16];
  undefined1 auVar995 [16];
  undefined1 auVar996 [16];
  undefined1 auVar997 [16];
  undefined1 auVar998 [16];
  undefined1 auVar999 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1047 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1056 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1060 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1103 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1112 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1122 [16];
  undefined1 auVar1123 [16];
  undefined1 auVar1124 [16];
  undefined1 auVar1125 [16];
  undefined1 auVar1126 [16];
  undefined1 auVar1127 [16];
  undefined1 auVar1128 [16];
  undefined1 auVar1129 [16];
  undefined1 auVar1130 [16];
  undefined1 auVar1131 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar1133 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar1141 [16];
  undefined1 auVar1142 [16];
  undefined1 auVar1143 [16];
  undefined1 auVar1144 [16];
  undefined1 auVar1145 [16];
  undefined1 auVar1146 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1148 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1151 [16];
  undefined1 auVar1152 [16];
  undefined1 auVar1153 [16];
  undefined1 auVar1154 [16];
  undefined1 auVar1155 [16];
  undefined1 auVar1156 [16];
  undefined1 auVar1157 [16];
  undefined1 auVar1158 [16];
  undefined1 auVar1159 [16];
  undefined1 auVar1160 [16];
  undefined1 auVar1161 [16];
  undefined1 auVar1162 [16];
  undefined1 auVar1163 [16];
  undefined1 auVar1164 [16];
  undefined1 auVar1165 [16];
  undefined1 auVar1166 [16];
  undefined1 auVar1167 [16];
  undefined1 auVar1168 [16];
  undefined1 auVar1169 [16];
  undefined1 auVar1170 [16];
  undefined1 auVar1171 [16];
  undefined1 auVar1172 [16];
  undefined1 auVar1173 [16];
  undefined1 auVar1174 [16];
  undefined1 auVar1175 [16];
  undefined1 auVar1176 [16];
  undefined1 auVar1177 [16];
  undefined1 auVar1178 [16];
  undefined1 auVar1179 [16];
  undefined1 auVar1180 [16];
  undefined1 auVar1181 [16];
  undefined1 auVar1182 [16];
  undefined1 auVar1183 [16];
  undefined1 auVar1184 [16];
  undefined1 auVar1185 [16];
  undefined1 auVar1186 [16];
  undefined1 auVar1187 [16];
  undefined1 auVar1188 [16];
  undefined1 auVar1189 [16];
  undefined1 auVar1190 [16];
  undefined1 auVar1191 [16];
  undefined1 auVar1192 [16];
  undefined1 auVar1193 [16];
  undefined1 auVar1194 [16];
  undefined1 auVar1195 [16];
  undefined1 auVar1196 [16];
  undefined1 auVar1197 [16];
  undefined1 auVar1198 [16];
  undefined1 auVar1199 [16];
  undefined1 auVar1200 [16];
  undefined1 auVar1201 [16];
  undefined1 auVar1202 [16];
  undefined1 auVar1203 [16];
  undefined1 auVar1204 [16];
  undefined1 auVar1205 [16];
  undefined1 auVar1206 [16];
  undefined1 auVar1207 [16];
  undefined1 auVar1208 [16];
  undefined1 auVar1209 [16];
  undefined1 auVar1210 [16];
  undefined1 auVar1211 [16];
  undefined1 auVar1212 [16];
  undefined1 auVar1213 [16];
  undefined1 auVar1214 [16];
  undefined1 auVar1215 [16];
  undefined1 auVar1216 [16];
  undefined1 auVar1217 [16];
  undefined1 auVar1218 [16];
  undefined1 auVar1219 [16];
  undefined1 auVar1220 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1222 [16];
  undefined1 auVar1223 [16];
  undefined1 auVar1224 [16];
  undefined1 auVar1225 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1234 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1244 [16];
  undefined1 auVar1245 [16];
  undefined1 auVar1246 [16];
  undefined1 auVar1247 [16];
  undefined1 auVar1248 [16];
  undefined1 auVar1249 [16];
  undefined1 auVar1250 [16];
  undefined1 auVar1251 [16];
  undefined1 auVar1252 [16];
  undefined1 auVar1253 [16];
  undefined1 auVar1254 [16];
  undefined1 auVar1255 [16];
  undefined1 auVar1256 [16];
  undefined1 auVar1257 [16];
  undefined1 auVar1258 [16];
  undefined1 auVar1259 [16];
  undefined1 auVar1260 [16];
  undefined1 auVar1261 [16];
  undefined1 auVar1262 [16];
  undefined1 auVar1263 [16];
  undefined1 auVar1264 [16];
  undefined1 auVar1265 [16];
  undefined1 auVar1266 [16];
  undefined1 auVar1267 [16];
  undefined1 auVar1268 [16];
  undefined1 auVar1269 [16];
  undefined1 auVar1270 [16];
  undefined1 auVar1271 [16];
  undefined1 auVar1272 [16];
  undefined1 auVar1273 [16];
  undefined1 auVar1274 [16];
  undefined1 auVar1275 [16];
  undefined1 auVar1276 [16];
  undefined1 auVar1277 [16];
  undefined1 auVar1278 [16];
  undefined1 auVar1279 [16];
  undefined1 auVar1280 [16];
  undefined1 auVar1281 [16];
  undefined1 auVar1282 [16];
  undefined1 auVar1283 [16];
  undefined1 auVar1284 [16];
  undefined1 auVar1285 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1287 [16];
  undefined1 auVar1288 [16];
  undefined1 auVar1289 [16];
  undefined1 auVar1290 [16];
  undefined1 auVar1291 [16];
  undefined1 auVar1292 [16];
  undefined1 auVar1293 [16];
  undefined1 auVar1294 [16];
  undefined1 auVar1295 [16];
  undefined1 auVar1296 [16];
  undefined1 auVar1297 [16];
  undefined1 auVar1298 [16];
  undefined1 auVar1299 [16];
  undefined1 auVar1300 [16];
  undefined1 auVar1301 [16];
  undefined1 auVar1302 [16];
  undefined1 auVar1303 [16];
  undefined1 auVar1304 [16];
  undefined1 auVar1305 [16];
  undefined1 auVar1306 [16];
  undefined1 auVar1307 [16];
  undefined1 auVar1308 [16];
  undefined1 auVar1309 [16];
  undefined1 auVar1310 [16];
  undefined1 auVar1311 [16];
  undefined1 auVar1312 [16];
  undefined1 auVar1313 [16];
  undefined1 auVar1314 [16];
  undefined1 auVar1315 [16];
  undefined1 auVar1316 [16];
  undefined1 auVar1317 [16];
  undefined1 auVar1318 [16];
  undefined1 auVar1319 [16];
  undefined1 auVar1320 [16];
  undefined1 auVar1321 [16];
  undefined1 auVar1322 [16];
  undefined1 auVar1323 [16];
  undefined1 auVar1324 [16];
  undefined1 auVar1325 [16];
  undefined1 auVar1326 [16];
  undefined1 auVar1327 [16];
  undefined1 auVar1328 [16];
  undefined1 auVar1329 [16];
  undefined1 auVar1330 [16];
  undefined1 auVar1331 [16];
  undefined1 auVar1332 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1334 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1336 [16];
  undefined1 auVar1337 [16];
  undefined1 auVar1338 [16];
  undefined1 auVar1339 [16];
  undefined1 auVar1340 [16];
  undefined1 auVar1341 [16];
  undefined1 auVar1342 [16];
  undefined1 auVar1343 [16];
  undefined1 auVar1344 [16];
  undefined1 auVar1345 [16];
  undefined1 auVar1346 [16];
  undefined1 auVar1347 [16];
  undefined1 auVar1348 [16];
  undefined1 auVar1349 [16];
  undefined1 auVar1350 [16];
  undefined1 auVar1351 [16];
  undefined1 auVar1352 [16];
  undefined1 auVar1353 [16];
  undefined1 auVar1354 [16];
  undefined1 auVar1355 [16];
  undefined1 auVar1356 [16];
  undefined1 auVar1357 [16];
  undefined1 auVar1358 [16];
  undefined1 auVar1359 [16];
  undefined1 auVar1360 [16];
  undefined1 auVar1361 [16];
  undefined1 auVar1362 [16];
  undefined1 auVar1363 [16];
  undefined1 auVar1364 [16];
  undefined1 auVar1365 [16];
  undefined1 auVar1366 [16];
  undefined1 auVar1367 [16];
  undefined1 auVar1368 [16];
  undefined1 auVar1369 [16];
  undefined1 auVar1370 [16];
  undefined1 auVar1371 [16];
  undefined1 auVar1372 [16];
  undefined1 auVar1373 [16];
  undefined1 auVar1374 [16];
  undefined1 auVar1375 [16];
  undefined1 auVar1376 [16];
  undefined1 auVar1377 [16];
  undefined1 auVar1378 [16];
  undefined1 auVar1379 [16];
  undefined1 auVar1380 [16];
  undefined1 auVar1381 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1383 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1392 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1404 [16];
  undefined1 auVar1405 [16];
  undefined1 auVar1406 [16];
  undefined1 auVar1407 [16];
  undefined1 auVar1408 [16];
  undefined1 auVar1409 [16];
  undefined1 auVar1410 [16];
  undefined1 auVar1411 [16];
  undefined1 auVar1412 [16];
  undefined1 auVar1413 [16];
  undefined1 auVar1414 [16];
  undefined1 auVar1415 [16];
  undefined1 auVar1416 [16];
  undefined1 auVar1417 [16];
  undefined1 auVar1418 [16];
  undefined1 auVar1419 [16];
  undefined1 auVar1420 [16];
  undefined1 auVar1421 [16];
  undefined1 auVar1422 [16];
  undefined1 auVar1423 [16];
  undefined1 auVar1424 [16];
  undefined1 auVar1425 [16];
  undefined1 auVar1426 [16];
  undefined1 auVar1427 [16];
  undefined1 auVar1428 [16];
  undefined1 auVar1429 [16];
  undefined1 auVar1430 [16];
  undefined1 auVar1431 [16];
  undefined1 auVar1432 [16];
  undefined1 auVar1433 [16];
  undefined1 auVar1434 [16];
  undefined1 auVar1435 [16];
  undefined1 auVar1436 [16];
  undefined1 auVar1437 [16];
  undefined1 auVar1438 [16];
  undefined1 auVar1439 [16];
  undefined1 auVar1440 [16];
  undefined1 auVar1441 [16];
  undefined1 auVar1442 [16];
  undefined1 auVar1443 [16];
  undefined1 auVar1444 [16];
  undefined1 auVar1445 [16];
  undefined1 auVar1446 [16];
  undefined1 auVar1447 [16];
  undefined1 auVar1448 [16];
  undefined1 auVar1449 [16];
  undefined1 auVar1450 [16];
  undefined1 auVar1451 [16];
  undefined1 auVar1452 [16];
  undefined1 auVar1453 [16];
  undefined1 auVar1454 [16];
  undefined1 auVar1455 [16];
  undefined1 auVar1456 [16];
  undefined1 auVar1457 [16];
  undefined1 auVar1458 [16];
  undefined1 auVar1459 [16];
  undefined1 auVar1460 [16];
  undefined1 auVar1461 [16];
  undefined1 auVar1462 [16];
  undefined1 auVar1463 [16];
  undefined1 auVar1464 [16];
  undefined1 auVar1465 [16];
  undefined1 auVar1466 [16];
  undefined1 auVar1467 [16];
  undefined1 auVar1468 [16];
  undefined1 auVar1469 [16];
  undefined1 auVar1470 [16];
  undefined1 auVar1471 [16];
  undefined1 auVar1472 [16];
  undefined1 auVar1473 [16];
  undefined1 auVar1474 [16];
  undefined1 auVar1475 [16];
  undefined1 auVar1476 [16];
  undefined1 auVar1477 [16];
  undefined1 auVar1478 [16];
  undefined1 auVar1479 [16];
  undefined1 auVar1480 [16];
  undefined1 auVar1481 [16];
  undefined1 auVar1482 [16];
  undefined1 auVar1483 [16];
  undefined1 auVar1484 [16];
  undefined1 auVar1485 [16];
  undefined1 auVar1486 [16];
  undefined1 auVar1487 [16];
  undefined1 auVar1488 [16];
  undefined1 auVar1489 [16];
  undefined1 auVar1490 [16];
  undefined1 auVar1491 [16];
  undefined1 auVar1492 [16];
  undefined1 auVar1493 [16];
  undefined1 auVar1494 [16];
  undefined1 auVar1495 [16];
  undefined1 auVar1496 [16];
  undefined1 auVar1497 [16];
  undefined1 auVar1498 [16];
  undefined1 auVar1499 [16];
  undefined1 auVar1500 [16];
  undefined1 auVar1501 [16];
  undefined1 auVar1502 [16];
  undefined1 auVar1503 [16];
  undefined1 auVar1504 [16];
  undefined1 auVar1505 [16];
  undefined1 auVar1506 [16];
  undefined1 auVar1507 [16];
  ulong uVar1508;
  ulong uVar1509;
  ulong uVar1510;
  ulong uVar1511;
  ulong uVar1512;
  ulong uVar1513;
  ulong uVar1514;
  int iVar1515;
  ulong uVar1516;
  ulong uVar1517;
  ulong uVar1518;
  uint64_t tmp3_20;
  uint64_t tmp3_22;
  uint64_t tmp1;
  secp256k1_fe t1;
  secp256k1_fe x44;
  secp256k1_fe x22;
  secp256k1_fe x88;
  secp256k1_fe x11;
  secp256k1_fe x223;
  secp256k1_fe x220;
  secp256k1_fe x176;
  secp256k1_fe x9;
  secp256k1_fe x6;
  secp256k1_fe x3;
  secp256k1_fe x2;
  secp256k1_fe local_288;
  secp256k1_fe *local_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  secp256k1_fe *local_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong local_198;
  ulong uStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong local_80;
  ulong uStack_78;
  ulong local_70;
  ulong uStack_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar1509 = a->n[0];
  uVar1514 = a->n[1];
  uVar1518 = a->n[2];
  uVar1510 = a->n[3];
  uVar1511 = a->n[4];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar1509 * 2;
  auVar711._8_8_ = 0;
  auVar711._0_8_ = uVar1510;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1514 * 2;
  auVar712._8_8_ = 0;
  auVar712._0_8_ = uVar1518;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1511;
  auVar713._8_8_ = 0;
  auVar713._0_8_ = uVar1511;
  uVar1508 = SUB168(auVar3 * auVar713,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1508 & 0xfffffffffffff;
  auVar1 = auVar2 * auVar712 + auVar1 * auVar711 + auVar4 * ZEXT816(0x1000003d10);
  uVar1512 = auVar1._0_8_;
  auVar1305._8_8_ = 0;
  auVar1305._0_8_ = uVar1512 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1511 = uVar1511 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1509;
  auVar714._8_8_ = 0;
  auVar714._0_8_ = uVar1511;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1514 * 2;
  auVar715._8_8_ = 0;
  auVar715._0_8_ = uVar1510;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1518;
  auVar716._8_8_ = 0;
  auVar716._0_8_ = uVar1518;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1508 >> 0x34 | SUB168(auVar3 * auVar713,8) << 0xc;
  auVar1 = auVar5 * auVar714 + auVar1305 + auVar6 * auVar715 + auVar7 * auVar716 +
           auVar8 * ZEXT816(0x1000003d10);
  uVar1513 = auVar1._0_8_;
  auVar1306._8_8_ = 0;
  auVar1306._0_8_ = uVar1513 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1509;
  auVar717._8_8_ = 0;
  auVar717._0_8_ = uVar1509;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1514;
  auVar718._8_8_ = 0;
  auVar718._0_8_ = uVar1511;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar1518 * 2;
  auVar719._8_8_ = 0;
  auVar719._0_8_ = uVar1510;
  auVar1 = auVar10 * auVar718 + auVar1306 + auVar11 * auVar719;
  uVar1508 = auVar1._0_8_;
  auVar1308._8_8_ = 0;
  auVar1308._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar720._8_8_ = 0;
  auVar720._0_8_ = (uVar1508 & 0xfffffffffffff) << 4 | (uVar1513 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar9 * auVar717 + ZEXT816(0x1000003d1) * auVar720;
  uVar1516 = auVar1._0_8_;
  uVar1508 = uVar1516 & 0xfffffffffffff;
  auVar1307._8_8_ = 0;
  auVar1307._0_8_ = uVar1516 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1509 * 2;
  auVar721._8_8_ = 0;
  auVar721._0_8_ = uVar1514;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar1518;
  auVar722._8_8_ = 0;
  auVar722._0_8_ = uVar1511;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1510;
  auVar723._8_8_ = 0;
  auVar723._0_8_ = uVar1510;
  auVar2 = auVar13 * auVar722 + auVar1308 + auVar14 * auVar723;
  uVar1516 = auVar2._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1516 & 0xfffffffffffff;
  auVar1 = auVar12 * auVar721 + auVar1307 + auVar15 * ZEXT816(0x1000003d10);
  uVar1517 = auVar1._0_8_;
  auVar1310._8_8_ = 0;
  auVar1310._0_8_ = uVar1516 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1516 = uVar1517 & 0xfffffffffffff;
  auVar1309._8_8_ = 0;
  auVar1309._0_8_ = uVar1517 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1509 * 2;
  auVar724._8_8_ = 0;
  auVar724._0_8_ = uVar1518;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1514;
  auVar725._8_8_ = 0;
  auVar725._0_8_ = uVar1514;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1510;
  auVar726._8_8_ = 0;
  auVar726._0_8_ = uVar1511;
  auVar1310 = auVar18 * auVar726 + auVar1310;
  uVar1514 = auVar1310._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1514 & 0xfffffffffffff;
  auVar1 = auVar16 * auVar724 + auVar1309 + auVar17 * auVar725 + auVar19 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  uVar1509 = uVar1518 & 0xfffffffffffff;
  auVar1311._8_8_ = 0;
  auVar1311._0_8_ = (uVar1518 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1512 & 0xfffffffffffff);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar1514 >> 0x34 | auVar1310._8_8_ << 0xc;
  auVar1311 = auVar20 * ZEXT816(0x1000003d10) + auVar1311;
  uVar1518 = auVar1311._0_8_;
  uVar1514 = uVar1518 & 0xfffffffffffff;
  uVar1512 = (uVar1518 >> 0x34 | auVar1311._8_8_ << 0xc) + (uVar1513 & 0xffffffffffff);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = a->n[0];
  auVar727._8_8_ = 0;
  auVar727._0_8_ = uVar1514;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = a->n[1];
  auVar728._8_8_ = 0;
  auVar728._0_8_ = uVar1509;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = a->n[2];
  auVar729._8_8_ = 0;
  auVar729._0_8_ = uVar1516;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = a->n[3];
  auVar730._8_8_ = 0;
  auVar730._0_8_ = uVar1508;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = a->n[4];
  auVar731._8_8_ = 0;
  auVar731._0_8_ = uVar1512;
  uVar1518 = SUB168(auVar25 * auVar731,0);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar22 * auVar728 + auVar21 * auVar727 + auVar23 * auVar729 + auVar24 * auVar730 +
           auVar26 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1312._8_8_ = 0;
  auVar1312._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = a->n[0];
  auVar732._8_8_ = 0;
  auVar732._0_8_ = uVar1512;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = a->n[1];
  auVar733._8_8_ = 0;
  auVar733._0_8_ = uVar1514;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = a->n[2];
  auVar734._8_8_ = 0;
  auVar734._0_8_ = uVar1509;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = a->n[3];
  auVar735._8_8_ = 0;
  auVar735._0_8_ = uVar1516;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = a->n[4];
  auVar736._8_8_ = 0;
  auVar736._0_8_ = uVar1508;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar1518 >> 0x34 | SUB168(auVar25 * auVar731,8) << 0xc;
  auVar1 = auVar27 * auVar732 + auVar1312 + auVar28 * auVar733 + auVar29 * auVar734 +
           auVar30 * auVar735 + auVar31 * auVar736 + auVar32 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1313._8_8_ = 0;
  auVar1313._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = a->n[0];
  auVar737._8_8_ = 0;
  auVar737._0_8_ = uVar1508;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = a->n[1];
  auVar738._8_8_ = 0;
  auVar738._0_8_ = uVar1512;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = a->n[2];
  auVar739._8_8_ = 0;
  auVar739._0_8_ = uVar1514;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = a->n[3];
  auVar740._8_8_ = 0;
  auVar740._0_8_ = uVar1509;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = a->n[4];
  auVar741._8_8_ = 0;
  auVar741._0_8_ = uVar1516;
  auVar1 = auVar34 * auVar738 + auVar1313 + auVar35 * auVar739 + auVar36 * auVar740 +
           auVar37 * auVar741;
  uVar1511 = auVar1._0_8_;
  auVar1315._8_8_ = 0;
  auVar1315._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar742._8_8_ = 0;
  auVar742._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar33 * auVar737 + ZEXT816(0x1000003d1) * auVar742;
  uVar1511 = auVar1._0_8_;
  local_58 = uVar1511 & 0xfffffffffffff;
  auVar1314._8_8_ = 0;
  auVar1314._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = a->n[0];
  auVar743._8_8_ = 0;
  auVar743._0_8_ = uVar1516;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = a->n[1];
  auVar744._8_8_ = 0;
  auVar744._0_8_ = uVar1508;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = a->n[2];
  auVar745._8_8_ = 0;
  auVar745._0_8_ = uVar1512;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = a->n[3];
  auVar746._8_8_ = 0;
  auVar746._0_8_ = uVar1514;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = a->n[4];
  auVar747._8_8_ = 0;
  auVar747._0_8_ = uVar1509;
  auVar2 = auVar40 * auVar745 + auVar1315 + auVar41 * auVar746 + auVar42 * auVar747;
  uVar1511 = auVar2._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar38 * auVar743 + auVar1314 + auVar39 * auVar744 + auVar43 * ZEXT816(0x1000003d10);
  uVar1513 = auVar1._0_8_;
  auVar1317._8_8_ = 0;
  auVar1317._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  local_50 = uVar1513 & 0xfffffffffffff;
  auVar1316._8_8_ = 0;
  auVar1316._0_8_ = uVar1513 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = a->n[0];
  auVar748._8_8_ = 0;
  auVar748._0_8_ = uVar1509;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = a->n[1];
  auVar749._8_8_ = 0;
  auVar749._0_8_ = uVar1516;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = a->n[2];
  auVar750._8_8_ = 0;
  auVar750._0_8_ = uVar1508;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = a->n[3];
  auVar751._8_8_ = 0;
  auVar751._0_8_ = uVar1512;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = a->n[4];
  auVar752._8_8_ = 0;
  auVar752._0_8_ = uVar1514;
  auVar2 = auVar47 * auVar751 + auVar1317 + auVar48 * auVar752;
  uVar1509 = auVar2._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar44 * auVar748 + auVar1316 + auVar45 * auVar749 + auVar46 * auVar750 +
           auVar49 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_48 = uVar1514 & 0xfffffffffffff;
  auVar1318._8_8_ = 0;
  auVar1318._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1318 = auVar50 * ZEXT816(0x1000003d10) + auVar1318;
  uVar1509 = auVar1318._0_8_;
  local_40 = uVar1509 & 0xfffffffffffff;
  local_38 = (uVar1509 >> 0x34 | auVar1318._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_58 * 2;
  auVar753._8_8_ = 0;
  auVar753._0_8_ = local_40;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_50 * 2;
  auVar754._8_8_ = 0;
  auVar754._0_8_ = local_48;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_38;
  auVar755._8_8_ = 0;
  auVar755._0_8_ = local_38;
  uVar1514 = SUB168(auVar53 * auVar755,0);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar1514 & 0xfffffffffffff;
  auVar1 = auVar52 * auVar754 + auVar51 * auVar753 + auVar54 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1319._8_8_ = 0;
  auVar1319._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1509 = local_38 * 2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_58;
  auVar756._8_8_ = 0;
  auVar756._0_8_ = uVar1509;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_50 * 2;
  auVar757._8_8_ = 0;
  auVar757._0_8_ = local_40;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_48;
  auVar758._8_8_ = 0;
  auVar758._0_8_ = local_48;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar1514 >> 0x34 | SUB168(auVar53 * auVar755,8) << 0xc;
  auVar1 = auVar55 * auVar756 + auVar1319 + auVar56 * auVar757 + auVar57 * auVar758 +
           auVar58 * ZEXT816(0x1000003d10);
  uVar1511 = auVar1._0_8_;
  auVar1320._8_8_ = 0;
  auVar1320._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_58;
  auVar759._8_8_ = 0;
  auVar759._0_8_ = local_58;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_50;
  auVar760._8_8_ = 0;
  auVar760._0_8_ = uVar1509;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_48 * 2;
  auVar761._8_8_ = 0;
  auVar761._0_8_ = local_40;
  auVar1 = auVar60 * auVar760 + auVar1320 + auVar61 * auVar761;
  uVar1514 = auVar1._0_8_;
  auVar1322._8_8_ = 0;
  auVar1322._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar762._8_8_ = 0;
  auVar762._0_8_ = (uVar1514 & 0xfffffffffffff) << 4 | (uVar1511 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar59 * auVar759 + ZEXT816(0x1000003d1) * auVar762;
  uVar1518 = auVar1._0_8_;
  uVar1514 = uVar1518 & 0xfffffffffffff;
  auVar1321._8_8_ = 0;
  auVar1321._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_58 * 2;
  auVar763._8_8_ = 0;
  auVar763._0_8_ = local_50;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_48;
  auVar764._8_8_ = 0;
  auVar764._0_8_ = uVar1509;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_40;
  auVar765._8_8_ = 0;
  auVar765._0_8_ = local_40;
  auVar2 = auVar63 * auVar764 + auVar1322 + auVar64 * auVar765;
  uVar1518 = auVar2._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar62 * auVar763 + auVar1321 + auVar65 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1324._8_8_ = 0;
  auVar1324._0_8_ = uVar1518 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1518 = uVar1508 & 0xfffffffffffff;
  auVar1323._8_8_ = 0;
  auVar1323._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_58 * 2;
  auVar766._8_8_ = 0;
  auVar766._0_8_ = local_48;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_50;
  auVar767._8_8_ = 0;
  auVar767._0_8_ = local_50;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_40;
  auVar768._8_8_ = 0;
  auVar768._0_8_ = uVar1509;
  auVar1324 = auVar68 * auVar768 + auVar1324;
  uVar1508 = auVar1324._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar1508 & 0xfffffffffffff;
  auVar1 = auVar66 * auVar766 + auVar1323 + auVar67 * auVar767 + auVar69 * ZEXT816(0x1000003d10);
  uVar1516 = auVar1._0_8_;
  uVar1509 = uVar1516 & 0xfffffffffffff;
  auVar1325._8_8_ = 0;
  auVar1325._0_8_ = (uVar1516 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar1508 >> 0x34 | auVar1324._8_8_ << 0xc;
  auVar1325 = auVar70 * ZEXT816(0x1000003d10) + auVar1325;
  uVar1508 = auVar1325._0_8_;
  uVar1510 = uVar1508 & 0xfffffffffffff;
  uVar1512 = (uVar1508 >> 0x34 | auVar1325._8_8_ << 0xc) + (uVar1511 & 0xffffffffffff);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = a->n[0];
  auVar769._8_8_ = 0;
  auVar769._0_8_ = uVar1510;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = a->n[1];
  auVar770._8_8_ = 0;
  auVar770._0_8_ = uVar1509;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = a->n[2];
  auVar771._8_8_ = 0;
  auVar771._0_8_ = uVar1518;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = a->n[3];
  auVar772._8_8_ = 0;
  auVar772._0_8_ = uVar1514;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = a->n[4];
  auVar773._8_8_ = 0;
  auVar773._0_8_ = uVar1512;
  uVar1511 = SUB168(auVar75 * auVar773,0);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar72 * auVar770 + auVar71 * auVar769 + auVar73 * auVar771 + auVar74 * auVar772 +
           auVar76 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1326._8_8_ = 0;
  auVar1326._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = a->n[0];
  auVar774._8_8_ = 0;
  auVar774._0_8_ = uVar1512;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = a->n[1];
  auVar775._8_8_ = 0;
  auVar775._0_8_ = uVar1510;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = a->n[2];
  auVar776._8_8_ = 0;
  auVar776._0_8_ = uVar1509;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = a->n[3];
  auVar777._8_8_ = 0;
  auVar777._0_8_ = uVar1518;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = a->n[4];
  auVar778._8_8_ = 0;
  auVar778._0_8_ = uVar1514;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar1511 >> 0x34 | SUB168(auVar75 * auVar773,8) << 0xc;
  auVar1 = auVar77 * auVar774 + auVar1326 + auVar78 * auVar775 + auVar79 * auVar776 +
           auVar80 * auVar777 + auVar81 * auVar778 + auVar82 * ZEXT816(0x1000003d10);
  uVar1511 = auVar1._0_8_;
  auVar1327._8_8_ = 0;
  auVar1327._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = a->n[0];
  auVar779._8_8_ = 0;
  auVar779._0_8_ = uVar1514;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = a->n[1];
  auVar780._8_8_ = 0;
  auVar780._0_8_ = uVar1512;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = a->n[2];
  auVar781._8_8_ = 0;
  auVar781._0_8_ = uVar1510;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = a->n[3];
  auVar782._8_8_ = 0;
  auVar782._0_8_ = uVar1509;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = a->n[4];
  auVar783._8_8_ = 0;
  auVar783._0_8_ = uVar1518;
  auVar1 = auVar84 * auVar780 + auVar1327 + auVar85 * auVar781 + auVar86 * auVar782 +
           auVar87 * auVar783;
  uVar1516 = auVar1._0_8_;
  auVar1329._8_8_ = 0;
  auVar1329._0_8_ = uVar1516 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar784._8_8_ = 0;
  auVar784._0_8_ = (uVar1516 & 0xfffffffffffff) << 4 | (uVar1511 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar83 * auVar779 + ZEXT816(0x1000003d1) * auVar784;
  uVar1516 = auVar1._0_8_;
  local_80 = uVar1516 & 0xfffffffffffff;
  auVar1328._8_8_ = 0;
  auVar1328._0_8_ = uVar1516 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = a->n[0];
  auVar785._8_8_ = 0;
  auVar785._0_8_ = uVar1518;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = a->n[1];
  auVar786._8_8_ = 0;
  auVar786._0_8_ = uVar1514;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = a->n[2];
  auVar787._8_8_ = 0;
  auVar787._0_8_ = uVar1512;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = a->n[3];
  auVar788._8_8_ = 0;
  auVar788._0_8_ = uVar1510;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = a->n[4];
  auVar789._8_8_ = 0;
  auVar789._0_8_ = uVar1509;
  auVar2 = auVar90 * auVar787 + auVar1329 + auVar91 * auVar788 + auVar92 * auVar789;
  uVar1516 = auVar2._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar1516 & 0xfffffffffffff;
  auVar1 = auVar88 * auVar785 + auVar1328 + auVar89 * auVar786 + auVar93 * ZEXT816(0x1000003d10);
  uVar1513 = auVar1._0_8_;
  auVar1331._8_8_ = 0;
  auVar1331._0_8_ = uVar1516 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_78 = uVar1513 & 0xfffffffffffff;
  auVar1330._8_8_ = 0;
  auVar1330._0_8_ = uVar1513 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = a->n[0];
  auVar790._8_8_ = 0;
  auVar790._0_8_ = uVar1509;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = a->n[1];
  auVar791._8_8_ = 0;
  auVar791._0_8_ = uVar1518;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = a->n[2];
  auVar792._8_8_ = 0;
  auVar792._0_8_ = uVar1514;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = a->n[3];
  auVar793._8_8_ = 0;
  auVar793._0_8_ = uVar1512;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = a->n[4];
  auVar794._8_8_ = 0;
  auVar794._0_8_ = uVar1510;
  auVar2 = auVar97 * auVar793 + auVar1331 + auVar98 * auVar794;
  uVar1509 = auVar2._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar94 * auVar790 + auVar1330 + auVar95 * auVar791 + auVar96 * auVar792 +
           auVar99 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_70 = uVar1514 & 0xfffffffffffff;
  auVar1332._8_8_ = 0;
  auVar1332._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1508 & 0xfffffffffffff);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1332 = auVar100 * ZEXT816(0x1000003d10) + auVar1332;
  uVar1509 = auVar1332._0_8_;
  uStack_68 = uVar1509 & 0xfffffffffffff;
  local_60 = (uVar1509 >> 0x34 | auVar1332._8_8_ << 0xc) + (uVar1511 & 0xffffffffffff);
  iVar1515 = 3;
  local_a8 = local_80;
  uStack_a0 = uStack_78;
  local_98 = local_70;
  uStack_90 = uStack_68;
  local_88 = local_60;
  do {
    auVar101._8_8_ = 0;
    auVar101._0_8_ = local_a8 * 2;
    auVar795._8_8_ = 0;
    auVar795._0_8_ = uStack_90;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uStack_a0 * 2;
    auVar796._8_8_ = 0;
    auVar796._0_8_ = local_98;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = local_88;
    auVar797._8_8_ = 0;
    auVar797._0_8_ = local_88;
    uVar1509 = SUB168(auVar103 * auVar797,0);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar102 * auVar796 + auVar101 * auVar795 + auVar104 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1333._8_8_ = 0;
    auVar1333._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_88 = local_88 * 2;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = local_a8;
    auVar798._8_8_ = 0;
    auVar798._0_8_ = local_88;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uStack_a0 * 2;
    auVar799._8_8_ = 0;
    auVar799._0_8_ = uStack_90;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = local_98;
    auVar800._8_8_ = 0;
    auVar800._0_8_ = local_98;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar1509 >> 0x34 | SUB168(auVar103 * auVar797,8) << 0xc;
    auVar1 = auVar105 * auVar798 + auVar1333 + auVar106 * auVar799 + auVar107 * auVar800 +
             auVar108 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1334._8_8_ = 0;
    auVar1334._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = local_a8;
    auVar801._8_8_ = 0;
    auVar801._0_8_ = local_a8;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uStack_a0;
    auVar802._8_8_ = 0;
    auVar802._0_8_ = local_88;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = local_98 * 2;
    auVar803._8_8_ = 0;
    auVar803._0_8_ = uStack_90;
    auVar1 = auVar110 * auVar802 + auVar1334 + auVar111 * auVar803;
    uVar1509 = auVar1._0_8_;
    auVar1336._8_8_ = 0;
    auVar1336._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar804._8_8_ = 0;
    auVar804._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar109 * auVar801 + ZEXT816(0x1000003d1) * auVar804;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1335._8_8_ = 0;
    auVar1335._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_a8 * 2;
    auVar805._8_8_ = 0;
    auVar805._0_8_ = uStack_a0;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = local_98;
    auVar806._8_8_ = 0;
    auVar806._0_8_ = local_88;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uStack_90;
    auVar807._8_8_ = 0;
    auVar807._0_8_ = uStack_90;
    auVar2 = auVar113 * auVar806 + auVar1336 + auVar114 * auVar807;
    uVar1514 = auVar2._0_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar112 * auVar805 + auVar1335 + auVar115 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1338._8_8_ = 0;
    auVar1338._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1337._8_8_ = 0;
    auVar1337._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_a8 * 2;
    auVar808._8_8_ = 0;
    auVar808._0_8_ = local_98;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uStack_a0;
    auVar809._8_8_ = 0;
    auVar809._0_8_ = uStack_a0;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uStack_90;
    auVar810._8_8_ = 0;
    auVar810._0_8_ = local_88;
    auVar1338 = auVar118 * auVar810 + auVar1338;
    uVar1511 = auVar1338._0_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar116 * auVar808 + auVar1337 + auVar117 * auVar809 +
             auVar119 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_98 = uVar1508 & 0xfffffffffffff;
    auVar1339._8_8_ = 0;
    auVar1339._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar1511 >> 0x34 | auVar1338._8_8_ << 0xc;
    auVar1339 = auVar120 * ZEXT816(0x1000003d10) + auVar1339;
    uVar1518 = auVar1339._0_8_;
    uStack_90 = uVar1518 & 0xfffffffffffff;
    local_88 = (uVar1518 >> 0x34 | auVar1339._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_a8 = uVar1509;
    uStack_a0 = uVar1514;
  } while (iVar1515 != 0);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = local_80;
  auVar811._8_8_ = 0;
  auVar811._0_8_ = uStack_90;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uStack_78;
  auVar812._8_8_ = 0;
  auVar812._0_8_ = local_98;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = local_70;
  auVar813._8_8_ = 0;
  auVar813._0_8_ = uVar1514;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uStack_68;
  auVar814._8_8_ = 0;
  auVar814._0_8_ = uVar1509;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = local_60;
  auVar815._8_8_ = 0;
  auVar815._0_8_ = local_88;
  uVar1518 = SUB168(auVar125 * auVar815,0);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar122 * auVar812 + auVar121 * auVar811 + auVar123 * auVar813 + auVar124 * auVar814 +
           auVar126 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1340._8_8_ = 0;
  auVar1340._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = local_80;
  auVar816._8_8_ = 0;
  auVar816._0_8_ = local_88;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uStack_78;
  auVar817._8_8_ = 0;
  auVar817._0_8_ = uStack_90;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_70;
  auVar818._8_8_ = 0;
  auVar818._0_8_ = local_98;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uStack_68;
  auVar819._8_8_ = 0;
  auVar819._0_8_ = uVar1514;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = local_60;
  auVar820._8_8_ = 0;
  auVar820._0_8_ = uVar1509;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar1518 >> 0x34 | SUB168(auVar125 * auVar815,8) << 0xc;
  auVar1 = auVar127 * auVar816 + auVar1340 + auVar128 * auVar817 + auVar129 * auVar818 +
           auVar130 * auVar819 + auVar131 * auVar820 + auVar132 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1341._8_8_ = 0;
  auVar1341._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_80;
  auVar821._8_8_ = 0;
  auVar821._0_8_ = uVar1509;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uStack_78;
  auVar822._8_8_ = 0;
  auVar822._0_8_ = local_88;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = local_70;
  auVar823._8_8_ = 0;
  auVar823._0_8_ = uStack_90;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uStack_68;
  auVar824._8_8_ = 0;
  auVar824._0_8_ = local_98;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = local_60;
  auVar825._8_8_ = 0;
  auVar825._0_8_ = uVar1514;
  auVar1 = auVar134 * auVar822 + auVar1341 + auVar135 * auVar823 + auVar136 * auVar824 +
           auVar137 * auVar825;
  uVar1511 = auVar1._0_8_;
  auVar1343._8_8_ = 0;
  auVar1343._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar826._8_8_ = 0;
  auVar826._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar133 * auVar821 + ZEXT816(0x1000003d1) * auVar826;
  uVar1511 = auVar1._0_8_;
  local_a8 = uVar1511 & 0xfffffffffffff;
  auVar1342._8_8_ = 0;
  auVar1342._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = local_80;
  auVar827._8_8_ = 0;
  auVar827._0_8_ = uVar1514;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uStack_78;
  auVar828._8_8_ = 0;
  auVar828._0_8_ = uVar1509;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = local_70;
  auVar829._8_8_ = 0;
  auVar829._0_8_ = local_88;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uStack_68;
  auVar830._8_8_ = 0;
  auVar830._0_8_ = uStack_90;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_60;
  auVar831._8_8_ = 0;
  auVar831._0_8_ = local_98;
  auVar2 = auVar140 * auVar829 + auVar1343 + auVar141 * auVar830 + auVar142 * auVar831;
  uVar1511 = auVar2._0_8_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar138 * auVar827 + auVar1342 + auVar139 * auVar828 + auVar143 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1345._8_8_ = 0;
  auVar1345._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_a0 = uVar1508 & 0xfffffffffffff;
  auVar1344._8_8_ = 0;
  auVar1344._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = local_80;
  auVar832._8_8_ = 0;
  auVar832._0_8_ = local_98;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uStack_78;
  auVar833._8_8_ = 0;
  auVar833._0_8_ = uVar1514;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_70;
  auVar834._8_8_ = 0;
  auVar834._0_8_ = uVar1509;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uStack_68;
  auVar835._8_8_ = 0;
  auVar835._0_8_ = local_88;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_60;
  auVar836._8_8_ = 0;
  auVar836._0_8_ = uStack_90;
  auVar2 = auVar147 * auVar835 + auVar1345 + auVar148 * auVar836;
  uVar1509 = auVar2._0_8_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar144 * auVar832 + auVar1344 + auVar145 * auVar833 + auVar146 * auVar834 +
           auVar149 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_98 = uVar1514 & 0xfffffffffffff;
  auVar1346._8_8_ = 0;
  auVar1346._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1346 = auVar150 * ZEXT816(0x1000003d10) + auVar1346;
  uVar1509 = auVar1346._0_8_;
  uStack_90 = uVar1509 & 0xfffffffffffff;
  local_88 = (uVar1509 >> 0x34 | auVar1346._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 3;
  local_d8 = local_a8;
  uStack_d0 = uStack_a0;
  local_c8 = local_98;
  uStack_c0 = uStack_90;
  local_b8 = local_88;
  do {
    auVar151._8_8_ = 0;
    auVar151._0_8_ = local_d8 * 2;
    auVar837._8_8_ = 0;
    auVar837._0_8_ = uStack_c0;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uStack_d0 * 2;
    auVar838._8_8_ = 0;
    auVar838._0_8_ = local_c8;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = local_b8;
    auVar839._8_8_ = 0;
    auVar839._0_8_ = local_b8;
    uVar1509 = SUB168(auVar153 * auVar839,0);
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar152 * auVar838 + auVar151 * auVar837 + auVar154 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1347._8_8_ = 0;
    auVar1347._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_b8 = local_b8 * 2;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = local_d8;
    auVar840._8_8_ = 0;
    auVar840._0_8_ = local_b8;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uStack_d0 * 2;
    auVar841._8_8_ = 0;
    auVar841._0_8_ = uStack_c0;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = local_c8;
    auVar842._8_8_ = 0;
    auVar842._0_8_ = local_c8;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar1509 >> 0x34 | SUB168(auVar153 * auVar839,8) << 0xc;
    auVar1 = auVar155 * auVar840 + auVar1347 + auVar156 * auVar841 + auVar157 * auVar842 +
             auVar158 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1348._8_8_ = 0;
    auVar1348._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = local_d8;
    auVar843._8_8_ = 0;
    auVar843._0_8_ = local_d8;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uStack_d0;
    auVar844._8_8_ = 0;
    auVar844._0_8_ = local_b8;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = local_c8 * 2;
    auVar845._8_8_ = 0;
    auVar845._0_8_ = uStack_c0;
    auVar1 = auVar160 * auVar844 + auVar1348 + auVar161 * auVar845;
    uVar1509 = auVar1._0_8_;
    auVar1350._8_8_ = 0;
    auVar1350._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar846._8_8_ = 0;
    auVar846._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar159 * auVar843 + ZEXT816(0x1000003d1) * auVar846;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1349._8_8_ = 0;
    auVar1349._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = local_d8 * 2;
    auVar847._8_8_ = 0;
    auVar847._0_8_ = uStack_d0;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = local_c8;
    auVar848._8_8_ = 0;
    auVar848._0_8_ = local_b8;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uStack_c0;
    auVar849._8_8_ = 0;
    auVar849._0_8_ = uStack_c0;
    auVar2 = auVar163 * auVar848 + auVar1350 + auVar164 * auVar849;
    uVar1514 = auVar2._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar162 * auVar847 + auVar1349 + auVar165 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1352._8_8_ = 0;
    auVar1352._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1351._8_8_ = 0;
    auVar1351._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = local_d8 * 2;
    auVar850._8_8_ = 0;
    auVar850._0_8_ = local_c8;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uStack_d0;
    auVar851._8_8_ = 0;
    auVar851._0_8_ = uStack_d0;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uStack_c0;
    auVar852._8_8_ = 0;
    auVar852._0_8_ = local_b8;
    auVar1352 = auVar168 * auVar852 + auVar1352;
    uVar1511 = auVar1352._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar166 * auVar850 + auVar1351 + auVar167 * auVar851 +
             auVar169 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_c8 = uVar1508 & 0xfffffffffffff;
    auVar1353._8_8_ = 0;
    auVar1353._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar1511 >> 0x34 | auVar1352._8_8_ << 0xc;
    auVar1353 = auVar170 * ZEXT816(0x1000003d10) + auVar1353;
    uVar1518 = auVar1353._0_8_;
    uStack_c0 = uVar1518 & 0xfffffffffffff;
    local_b8 = (uVar1518 >> 0x34 | auVar1353._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_d8 = uVar1509;
    uStack_d0 = uVar1514;
  } while (iVar1515 != 0);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = local_80;
  auVar853._8_8_ = 0;
  auVar853._0_8_ = uStack_c0;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uStack_78;
  auVar854._8_8_ = 0;
  auVar854._0_8_ = local_c8;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = local_70;
  auVar855._8_8_ = 0;
  auVar855._0_8_ = uVar1514;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uStack_68;
  auVar856._8_8_ = 0;
  auVar856._0_8_ = uVar1509;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = local_60;
  auVar857._8_8_ = 0;
  auVar857._0_8_ = local_b8;
  uVar1518 = SUB168(auVar175 * auVar857,0);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar172 * auVar854 + auVar171 * auVar853 + auVar173 * auVar855 + auVar174 * auVar856 +
           auVar176 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1354._8_8_ = 0;
  auVar1354._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = local_80;
  auVar858._8_8_ = 0;
  auVar858._0_8_ = local_b8;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uStack_78;
  auVar859._8_8_ = 0;
  auVar859._0_8_ = uStack_c0;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = local_70;
  auVar860._8_8_ = 0;
  auVar860._0_8_ = local_c8;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uStack_68;
  auVar861._8_8_ = 0;
  auVar861._0_8_ = uVar1514;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = local_60;
  auVar862._8_8_ = 0;
  auVar862._0_8_ = uVar1509;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar1518 >> 0x34 | SUB168(auVar175 * auVar857,8) << 0xc;
  auVar1 = auVar177 * auVar858 + auVar1354 + auVar178 * auVar859 + auVar179 * auVar860 +
           auVar180 * auVar861 + auVar181 * auVar862 + auVar182 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1355._8_8_ = 0;
  auVar1355._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = local_80;
  auVar863._8_8_ = 0;
  auVar863._0_8_ = uVar1509;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uStack_78;
  auVar864._8_8_ = 0;
  auVar864._0_8_ = local_b8;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = local_70;
  auVar865._8_8_ = 0;
  auVar865._0_8_ = uStack_c0;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uStack_68;
  auVar866._8_8_ = 0;
  auVar866._0_8_ = local_c8;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_60;
  auVar867._8_8_ = 0;
  auVar867._0_8_ = uVar1514;
  auVar1 = auVar184 * auVar864 + auVar1355 + auVar185 * auVar865 + auVar186 * auVar866 +
           auVar187 * auVar867;
  uVar1511 = auVar1._0_8_;
  auVar1357._8_8_ = 0;
  auVar1357._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar868._8_8_ = 0;
  auVar868._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar183 * auVar863 + ZEXT816(0x1000003d1) * auVar868;
  uVar1511 = auVar1._0_8_;
  local_d8 = uVar1511 & 0xfffffffffffff;
  auVar1356._8_8_ = 0;
  auVar1356._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = local_80;
  auVar869._8_8_ = 0;
  auVar869._0_8_ = uVar1514;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uStack_78;
  auVar870._8_8_ = 0;
  auVar870._0_8_ = uVar1509;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = local_70;
  auVar871._8_8_ = 0;
  auVar871._0_8_ = local_b8;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uStack_68;
  auVar872._8_8_ = 0;
  auVar872._0_8_ = uStack_c0;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = local_60;
  auVar873._8_8_ = 0;
  auVar873._0_8_ = local_c8;
  auVar2 = auVar190 * auVar871 + auVar1357 + auVar191 * auVar872 + auVar192 * auVar873;
  uVar1511 = auVar2._0_8_;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar188 * auVar869 + auVar1356 + auVar189 * auVar870 + auVar193 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1359._8_8_ = 0;
  auVar1359._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_d0 = uVar1508 & 0xfffffffffffff;
  auVar1358._8_8_ = 0;
  auVar1358._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = local_80;
  auVar874._8_8_ = 0;
  auVar874._0_8_ = local_c8;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uStack_78;
  auVar875._8_8_ = 0;
  auVar875._0_8_ = uVar1514;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = local_70;
  auVar876._8_8_ = 0;
  auVar876._0_8_ = uVar1509;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uStack_68;
  auVar877._8_8_ = 0;
  auVar877._0_8_ = local_b8;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = local_60;
  auVar878._8_8_ = 0;
  auVar878._0_8_ = uStack_c0;
  auVar2 = auVar197 * auVar877 + auVar1359 + auVar198 * auVar878;
  uVar1509 = auVar2._0_8_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar194 * auVar874 + auVar1358 + auVar195 * auVar875 + auVar196 * auVar876 +
           auVar199 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_c8 = uVar1514 & 0xfffffffffffff;
  auVar1360._8_8_ = 0;
  auVar1360._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1360 = auVar200 * ZEXT816(0x1000003d10) + auVar1360;
  uVar1509 = auVar1360._0_8_;
  uStack_c0 = uVar1509 & 0xfffffffffffff;
  local_b8 = (uVar1509 >> 0x34 | auVar1360._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 1;
  local_198 = local_d8;
  uStack_190 = uStack_d0;
  local_188 = local_c8;
  uStack_180 = uStack_c0;
  local_178 = local_b8;
  do {
    auVar201._8_8_ = 0;
    auVar201._0_8_ = local_198 * 2;
    auVar879._8_8_ = 0;
    auVar879._0_8_ = uStack_180;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uStack_190 * 2;
    auVar880._8_8_ = 0;
    auVar880._0_8_ = local_188;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = local_178;
    auVar881._8_8_ = 0;
    auVar881._0_8_ = local_178;
    uVar1509 = SUB168(auVar203 * auVar881,0);
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar202 * auVar880 + auVar201 * auVar879 + auVar204 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1361._8_8_ = 0;
    auVar1361._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_178 = local_178 * 2;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = local_198;
    auVar882._8_8_ = 0;
    auVar882._0_8_ = local_178;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uStack_190 * 2;
    auVar883._8_8_ = 0;
    auVar883._0_8_ = uStack_180;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = local_188;
    auVar884._8_8_ = 0;
    auVar884._0_8_ = local_188;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar1509 >> 0x34 | SUB168(auVar203 * auVar881,8) << 0xc;
    auVar1 = auVar205 * auVar882 + auVar1361 + auVar206 * auVar883 + auVar207 * auVar884 +
             auVar208 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1362._8_8_ = 0;
    auVar1362._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = local_198;
    auVar885._8_8_ = 0;
    auVar885._0_8_ = local_198;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uStack_190;
    auVar886._8_8_ = 0;
    auVar886._0_8_ = local_178;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = local_188 * 2;
    auVar887._8_8_ = 0;
    auVar887._0_8_ = uStack_180;
    auVar1 = auVar210 * auVar886 + auVar1362 + auVar211 * auVar887;
    uVar1509 = auVar1._0_8_;
    auVar1364._8_8_ = 0;
    auVar1364._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar888._8_8_ = 0;
    auVar888._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar209 * auVar885 + ZEXT816(0x1000003d1) * auVar888;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1363._8_8_ = 0;
    auVar1363._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = local_198 * 2;
    auVar889._8_8_ = 0;
    auVar889._0_8_ = uStack_190;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = local_188;
    auVar890._8_8_ = 0;
    auVar890._0_8_ = local_178;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uStack_180;
    auVar891._8_8_ = 0;
    auVar891._0_8_ = uStack_180;
    auVar2 = auVar213 * auVar890 + auVar1364 + auVar214 * auVar891;
    uVar1514 = auVar2._0_8_;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar212 * auVar889 + auVar1363 + auVar215 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1366._8_8_ = 0;
    auVar1366._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1365._8_8_ = 0;
    auVar1365._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = local_198 * 2;
    auVar892._8_8_ = 0;
    auVar892._0_8_ = local_188;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = uStack_190;
    auVar893._8_8_ = 0;
    auVar893._0_8_ = uStack_190;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = uStack_180;
    auVar894._8_8_ = 0;
    auVar894._0_8_ = local_178;
    auVar1366 = auVar218 * auVar894 + auVar1366;
    uVar1511 = auVar1366._0_8_;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar216 * auVar892 + auVar1365 + auVar217 * auVar893 +
             auVar219 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_188 = uVar1508 & 0xfffffffffffff;
    auVar1367._8_8_ = 0;
    auVar1367._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar1511 >> 0x34 | auVar1366._8_8_ << 0xc;
    auVar1367 = auVar220 * ZEXT816(0x1000003d10) + auVar1367;
    uVar1518 = auVar1367._0_8_;
    uStack_180 = uVar1518 & 0xfffffffffffff;
    local_178 = (uVar1518 >> 0x34 | auVar1367._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_198 = uVar1509;
    uStack_190 = uVar1514;
  } while (iVar1515 == 0);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = local_58;
  auVar895._8_8_ = 0;
  auVar895._0_8_ = uStack_180;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = local_50;
  auVar896._8_8_ = 0;
  auVar896._0_8_ = local_188;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = local_48;
  auVar897._8_8_ = 0;
  auVar897._0_8_ = uVar1514;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = local_40;
  auVar898._8_8_ = 0;
  auVar898._0_8_ = uVar1509;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = local_38;
  auVar899._8_8_ = 0;
  auVar899._0_8_ = local_178;
  uVar1518 = SUB168(auVar225 * auVar899,0);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar222 * auVar896 + auVar221 * auVar895 + auVar223 * auVar897 + auVar224 * auVar898 +
           auVar226 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1368._8_8_ = 0;
  auVar1368._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = local_58;
  auVar900._8_8_ = 0;
  auVar900._0_8_ = local_178;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = local_50;
  auVar901._8_8_ = 0;
  auVar901._0_8_ = uStack_180;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = local_48;
  auVar902._8_8_ = 0;
  auVar902._0_8_ = local_188;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = local_40;
  auVar903._8_8_ = 0;
  auVar903._0_8_ = uVar1514;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = local_38;
  auVar904._8_8_ = 0;
  auVar904._0_8_ = uVar1509;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar1518 >> 0x34 | SUB168(auVar225 * auVar899,8) << 0xc;
  auVar1 = auVar227 * auVar900 + auVar1368 + auVar228 * auVar901 + auVar229 * auVar902 +
           auVar230 * auVar903 + auVar231 * auVar904 + auVar232 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1369._8_8_ = 0;
  auVar1369._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = local_58;
  auVar905._8_8_ = 0;
  auVar905._0_8_ = uVar1509;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = local_50;
  auVar906._8_8_ = 0;
  auVar906._0_8_ = local_178;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = local_48;
  auVar907._8_8_ = 0;
  auVar907._0_8_ = uStack_180;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = local_40;
  auVar908._8_8_ = 0;
  auVar908._0_8_ = local_188;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = local_38;
  auVar909._8_8_ = 0;
  auVar909._0_8_ = uVar1514;
  auVar1 = auVar234 * auVar906 + auVar1369 + auVar235 * auVar907 + auVar236 * auVar908 +
           auVar237 * auVar909;
  uVar1511 = auVar1._0_8_;
  auVar1371._8_8_ = 0;
  auVar1371._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar910._8_8_ = 0;
  auVar910._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar233 * auVar905 + ZEXT816(0x1000003d1) * auVar910;
  uVar1511 = auVar1._0_8_;
  local_198 = uVar1511 & 0xfffffffffffff;
  auVar1370._8_8_ = 0;
  auVar1370._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = local_58;
  auVar911._8_8_ = 0;
  auVar911._0_8_ = uVar1514;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = local_50;
  auVar912._8_8_ = 0;
  auVar912._0_8_ = uVar1509;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = local_48;
  auVar913._8_8_ = 0;
  auVar913._0_8_ = local_178;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = local_40;
  auVar914._8_8_ = 0;
  auVar914._0_8_ = uStack_180;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = local_38;
  auVar915._8_8_ = 0;
  auVar915._0_8_ = local_188;
  auVar2 = auVar240 * auVar913 + auVar1371 + auVar241 * auVar914 + auVar242 * auVar915;
  uVar1511 = auVar2._0_8_;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar238 * auVar911 + auVar1370 + auVar239 * auVar912 + auVar243 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1373._8_8_ = 0;
  auVar1373._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_190 = uVar1508 & 0xfffffffffffff;
  auVar1372._8_8_ = 0;
  auVar1372._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = local_58;
  auVar916._8_8_ = 0;
  auVar916._0_8_ = local_188;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = local_50;
  auVar917._8_8_ = 0;
  auVar917._0_8_ = uVar1514;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = local_48;
  auVar918._8_8_ = 0;
  auVar918._0_8_ = uVar1509;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = local_40;
  auVar919._8_8_ = 0;
  auVar919._0_8_ = local_178;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = local_38;
  auVar920._8_8_ = 0;
  auVar920._0_8_ = uStack_180;
  auVar2 = auVar247 * auVar919 + auVar1373 + auVar248 * auVar920;
  uVar1509 = auVar2._0_8_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar244 * auVar916 + auVar1372 + auVar245 * auVar917 + auVar246 * auVar918 +
           auVar249 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_188 = uVar1514 & 0xfffffffffffff;
  auVar1374._8_8_ = 0;
  auVar1374._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1374 = auVar250 * ZEXT816(0x1000003d10) + auVar1374;
  uVar1509 = auVar1374._0_8_;
  uStack_180 = uVar1509 & 0xfffffffffffff;
  local_178 = (uVar1509 >> 0x34 | auVar1374._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 0xb;
  local_1f8 = local_198;
  uStack_1f0 = uStack_190;
  local_1e8 = local_188;
  uStack_1e0 = uStack_180;
  local_1d8 = local_178;
  do {
    auVar251._8_8_ = 0;
    auVar251._0_8_ = local_1f8 * 2;
    auVar921._8_8_ = 0;
    auVar921._0_8_ = uStack_1e0;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = uStack_1f0 * 2;
    auVar922._8_8_ = 0;
    auVar922._0_8_ = local_1e8;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = local_1d8;
    auVar923._8_8_ = 0;
    auVar923._0_8_ = local_1d8;
    uVar1509 = SUB168(auVar253 * auVar923,0);
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar252 * auVar922 + auVar251 * auVar921 + auVar254 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1375._8_8_ = 0;
    auVar1375._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_1d8 = local_1d8 * 2;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = local_1f8;
    auVar924._8_8_ = 0;
    auVar924._0_8_ = local_1d8;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uStack_1f0 * 2;
    auVar925._8_8_ = 0;
    auVar925._0_8_ = uStack_1e0;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = local_1e8;
    auVar926._8_8_ = 0;
    auVar926._0_8_ = local_1e8;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar1509 >> 0x34 | SUB168(auVar253 * auVar923,8) << 0xc;
    auVar1 = auVar255 * auVar924 + auVar1375 + auVar256 * auVar925 + auVar257 * auVar926 +
             auVar258 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1376._8_8_ = 0;
    auVar1376._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = local_1f8;
    auVar927._8_8_ = 0;
    auVar927._0_8_ = local_1f8;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = uStack_1f0;
    auVar928._8_8_ = 0;
    auVar928._0_8_ = local_1d8;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = local_1e8 * 2;
    auVar929._8_8_ = 0;
    auVar929._0_8_ = uStack_1e0;
    auVar1 = auVar260 * auVar928 + auVar1376 + auVar261 * auVar929;
    uVar1509 = auVar1._0_8_;
    auVar1378._8_8_ = 0;
    auVar1378._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar930._8_8_ = 0;
    auVar930._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar259 * auVar927 + ZEXT816(0x1000003d1) * auVar930;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1377._8_8_ = 0;
    auVar1377._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = local_1f8 * 2;
    auVar931._8_8_ = 0;
    auVar931._0_8_ = uStack_1f0;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = local_1e8;
    auVar932._8_8_ = 0;
    auVar932._0_8_ = local_1d8;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = uStack_1e0;
    auVar933._8_8_ = 0;
    auVar933._0_8_ = uStack_1e0;
    auVar2 = auVar263 * auVar932 + auVar1378 + auVar264 * auVar933;
    uVar1514 = auVar2._0_8_;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar262 * auVar931 + auVar1377 + auVar265 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1380._8_8_ = 0;
    auVar1380._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1379._8_8_ = 0;
    auVar1379._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = local_1f8 * 2;
    auVar934._8_8_ = 0;
    auVar934._0_8_ = local_1e8;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = uStack_1f0;
    auVar935._8_8_ = 0;
    auVar935._0_8_ = uStack_1f0;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = uStack_1e0;
    auVar936._8_8_ = 0;
    auVar936._0_8_ = local_1d8;
    auVar1380 = auVar268 * auVar936 + auVar1380;
    uVar1511 = auVar1380._0_8_;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar266 * auVar934 + auVar1379 + auVar267 * auVar935 +
             auVar269 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_1e8 = uVar1508 & 0xfffffffffffff;
    auVar1381._8_8_ = 0;
    auVar1381._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar270._8_8_ = 0;
    auVar270._0_8_ = uVar1511 >> 0x34 | auVar1380._8_8_ << 0xc;
    auVar1381 = auVar270 * ZEXT816(0x1000003d10) + auVar1381;
    uVar1518 = auVar1381._0_8_;
    uStack_1e0 = uVar1518 & 0xfffffffffffff;
    local_1d8 = (uVar1518 >> 0x34 | auVar1381._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_1f8 = uVar1509;
    uStack_1f0 = uVar1514;
  } while (iVar1515 != 0);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = local_198;
  auVar937._8_8_ = 0;
  auVar937._0_8_ = uStack_1e0;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uStack_190;
  auVar938._8_8_ = 0;
  auVar938._0_8_ = local_1e8;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = local_188;
  auVar939._8_8_ = 0;
  auVar939._0_8_ = uVar1514;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uStack_180;
  auVar940._8_8_ = 0;
  auVar940._0_8_ = uVar1509;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = local_178;
  auVar941._8_8_ = 0;
  auVar941._0_8_ = local_1d8;
  uVar1518 = SUB168(auVar275 * auVar941,0);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar272 * auVar938 + auVar271 * auVar937 + auVar273 * auVar939 + auVar274 * auVar940 +
           auVar276 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1382._8_8_ = 0;
  auVar1382._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = local_198;
  auVar942._8_8_ = 0;
  auVar942._0_8_ = local_1d8;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uStack_190;
  auVar943._8_8_ = 0;
  auVar943._0_8_ = uStack_1e0;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = local_188;
  auVar944._8_8_ = 0;
  auVar944._0_8_ = local_1e8;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uStack_180;
  auVar945._8_8_ = 0;
  auVar945._0_8_ = uVar1514;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = local_178;
  auVar946._8_8_ = 0;
  auVar946._0_8_ = uVar1509;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar1518 >> 0x34 | SUB168(auVar275 * auVar941,8) << 0xc;
  auVar1 = auVar277 * auVar942 + auVar1382 + auVar278 * auVar943 + auVar279 * auVar944 +
           auVar280 * auVar945 + auVar281 * auVar946 + auVar282 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1383._8_8_ = 0;
  auVar1383._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = local_198;
  auVar947._8_8_ = 0;
  auVar947._0_8_ = uVar1509;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uStack_190;
  auVar948._8_8_ = 0;
  auVar948._0_8_ = local_1d8;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = local_188;
  auVar949._8_8_ = 0;
  auVar949._0_8_ = uStack_1e0;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uStack_180;
  auVar950._8_8_ = 0;
  auVar950._0_8_ = local_1e8;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = local_178;
  auVar951._8_8_ = 0;
  auVar951._0_8_ = uVar1514;
  auVar1 = auVar284 * auVar948 + auVar1383 + auVar285 * auVar949 + auVar286 * auVar950 +
           auVar287 * auVar951;
  uVar1511 = auVar1._0_8_;
  auVar1385._8_8_ = 0;
  auVar1385._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar952._8_8_ = 0;
  auVar952._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar283 * auVar947 + ZEXT816(0x1000003d1) * auVar952;
  uVar1511 = auVar1._0_8_;
  local_1f8 = uVar1511 & 0xfffffffffffff;
  auVar1384._8_8_ = 0;
  auVar1384._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = local_198;
  auVar953._8_8_ = 0;
  auVar953._0_8_ = uVar1514;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uStack_190;
  auVar954._8_8_ = 0;
  auVar954._0_8_ = uVar1509;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = local_188;
  auVar955._8_8_ = 0;
  auVar955._0_8_ = local_1d8;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uStack_180;
  auVar956._8_8_ = 0;
  auVar956._0_8_ = uStack_1e0;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = local_178;
  auVar957._8_8_ = 0;
  auVar957._0_8_ = local_1e8;
  auVar2 = auVar290 * auVar955 + auVar1385 + auVar291 * auVar956 + auVar292 * auVar957;
  uVar1511 = auVar2._0_8_;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar288 * auVar953 + auVar1384 + auVar289 * auVar954 + auVar293 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1387._8_8_ = 0;
  auVar1387._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_1f0 = uVar1508 & 0xfffffffffffff;
  auVar1386._8_8_ = 0;
  auVar1386._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = local_198;
  auVar958._8_8_ = 0;
  auVar958._0_8_ = local_1e8;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uStack_190;
  auVar959._8_8_ = 0;
  auVar959._0_8_ = uVar1514;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = local_188;
  auVar960._8_8_ = 0;
  auVar960._0_8_ = uVar1509;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uStack_180;
  auVar961._8_8_ = 0;
  auVar961._0_8_ = local_1d8;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = local_178;
  auVar962._8_8_ = 0;
  auVar962._0_8_ = uStack_1e0;
  auVar2 = auVar297 * auVar961 + auVar1387 + auVar298 * auVar962;
  uVar1509 = auVar2._0_8_;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar294 * auVar958 + auVar1386 + auVar295 * auVar959 + auVar296 * auVar960 +
           auVar299 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_1e8 = uVar1514 & 0xfffffffffffff;
  auVar1388._8_8_ = 0;
  auVar1388._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1388 = auVar300 * ZEXT816(0x1000003d10) + auVar1388;
  uVar1509 = auVar1388._0_8_;
  uStack_1e0 = uVar1509 & 0xfffffffffffff;
  local_1d8 = (uVar1509 >> 0x34 | auVar1388._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 0x16;
  local_228 = local_1f8;
  uStack_220 = uStack_1f0;
  local_218 = local_1e8;
  uStack_210 = uStack_1e0;
  local_208 = local_1d8;
  do {
    auVar301._8_8_ = 0;
    auVar301._0_8_ = local_228 * 2;
    auVar963._8_8_ = 0;
    auVar963._0_8_ = uStack_210;
    auVar302._8_8_ = 0;
    auVar302._0_8_ = uStack_220 * 2;
    auVar964._8_8_ = 0;
    auVar964._0_8_ = local_218;
    auVar303._8_8_ = 0;
    auVar303._0_8_ = local_208;
    auVar965._8_8_ = 0;
    auVar965._0_8_ = local_208;
    uVar1509 = SUB168(auVar303 * auVar965,0);
    auVar304._8_8_ = 0;
    auVar304._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar302 * auVar964 + auVar301 * auVar963 + auVar304 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1389._8_8_ = 0;
    auVar1389._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_208 = local_208 * 2;
    auVar305._8_8_ = 0;
    auVar305._0_8_ = local_228;
    auVar966._8_8_ = 0;
    auVar966._0_8_ = local_208;
    auVar306._8_8_ = 0;
    auVar306._0_8_ = uStack_220 * 2;
    auVar967._8_8_ = 0;
    auVar967._0_8_ = uStack_210;
    auVar307._8_8_ = 0;
    auVar307._0_8_ = local_218;
    auVar968._8_8_ = 0;
    auVar968._0_8_ = local_218;
    auVar308._8_8_ = 0;
    auVar308._0_8_ = uVar1509 >> 0x34 | SUB168(auVar303 * auVar965,8) << 0xc;
    auVar1 = auVar305 * auVar966 + auVar1389 + auVar306 * auVar967 + auVar307 * auVar968 +
             auVar308 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1390._8_8_ = 0;
    auVar1390._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar309._8_8_ = 0;
    auVar309._0_8_ = local_228;
    auVar969._8_8_ = 0;
    auVar969._0_8_ = local_228;
    auVar310._8_8_ = 0;
    auVar310._0_8_ = uStack_220;
    auVar970._8_8_ = 0;
    auVar970._0_8_ = local_208;
    auVar311._8_8_ = 0;
    auVar311._0_8_ = local_218 * 2;
    auVar971._8_8_ = 0;
    auVar971._0_8_ = uStack_210;
    auVar1 = auVar310 * auVar970 + auVar1390 + auVar311 * auVar971;
    uVar1509 = auVar1._0_8_;
    auVar1392._8_8_ = 0;
    auVar1392._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar972._8_8_ = 0;
    auVar972._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar309 * auVar969 + ZEXT816(0x1000003d1) * auVar972;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1391._8_8_ = 0;
    auVar1391._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar312._8_8_ = 0;
    auVar312._0_8_ = local_228 * 2;
    auVar973._8_8_ = 0;
    auVar973._0_8_ = uStack_220;
    auVar313._8_8_ = 0;
    auVar313._0_8_ = local_218;
    auVar974._8_8_ = 0;
    auVar974._0_8_ = local_208;
    auVar314._8_8_ = 0;
    auVar314._0_8_ = uStack_210;
    auVar975._8_8_ = 0;
    auVar975._0_8_ = uStack_210;
    auVar2 = auVar313 * auVar974 + auVar1392 + auVar314 * auVar975;
    uVar1514 = auVar2._0_8_;
    auVar315._8_8_ = 0;
    auVar315._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar312 * auVar973 + auVar1391 + auVar315 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1394._8_8_ = 0;
    auVar1394._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1393._8_8_ = 0;
    auVar1393._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar316._8_8_ = 0;
    auVar316._0_8_ = local_228 * 2;
    auVar976._8_8_ = 0;
    auVar976._0_8_ = local_218;
    auVar317._8_8_ = 0;
    auVar317._0_8_ = uStack_220;
    auVar977._8_8_ = 0;
    auVar977._0_8_ = uStack_220;
    auVar318._8_8_ = 0;
    auVar318._0_8_ = uStack_210;
    auVar978._8_8_ = 0;
    auVar978._0_8_ = local_208;
    auVar1394 = auVar318 * auVar978 + auVar1394;
    uVar1511 = auVar1394._0_8_;
    auVar319._8_8_ = 0;
    auVar319._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar316 * auVar976 + auVar1393 + auVar317 * auVar977 +
             auVar319 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_218 = uVar1508 & 0xfffffffffffff;
    auVar1395._8_8_ = 0;
    auVar1395._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar320._8_8_ = 0;
    auVar320._0_8_ = uVar1511 >> 0x34 | auVar1394._8_8_ << 0xc;
    auVar1395 = auVar320 * ZEXT816(0x1000003d10) + auVar1395;
    uVar1518 = auVar1395._0_8_;
    uStack_210 = uVar1518 & 0xfffffffffffff;
    local_208 = (uVar1518 >> 0x34 | auVar1395._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_228 = uVar1509;
    uStack_220 = uVar1514;
  } while (iVar1515 != 0);
  auVar321._8_8_ = 0;
  auVar321._0_8_ = local_1f8;
  auVar979._8_8_ = 0;
  auVar979._0_8_ = uStack_210;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uStack_1f0;
  auVar980._8_8_ = 0;
  auVar980._0_8_ = local_218;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = local_1e8;
  auVar981._8_8_ = 0;
  auVar981._0_8_ = uVar1514;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uStack_1e0;
  auVar982._8_8_ = 0;
  auVar982._0_8_ = uVar1509;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = local_1d8;
  auVar983._8_8_ = 0;
  auVar983._0_8_ = local_208;
  uVar1518 = SUB168(auVar325 * auVar983,0);
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar322 * auVar980 + auVar321 * auVar979 + auVar323 * auVar981 + auVar324 * auVar982 +
           auVar326 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1396._8_8_ = 0;
  auVar1396._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = local_1f8;
  auVar984._8_8_ = 0;
  auVar984._0_8_ = local_208;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uStack_1f0;
  auVar985._8_8_ = 0;
  auVar985._0_8_ = uStack_210;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = local_1e8;
  auVar986._8_8_ = 0;
  auVar986._0_8_ = local_218;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uStack_1e0;
  auVar987._8_8_ = 0;
  auVar987._0_8_ = uVar1514;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = local_1d8;
  auVar988._8_8_ = 0;
  auVar988._0_8_ = uVar1509;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar1518 >> 0x34 | SUB168(auVar325 * auVar983,8) << 0xc;
  auVar1 = auVar327 * auVar984 + auVar1396 + auVar328 * auVar985 + auVar329 * auVar986 +
           auVar330 * auVar987 + auVar331 * auVar988 + auVar332 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1397._8_8_ = 0;
  auVar1397._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = local_1f8;
  auVar989._8_8_ = 0;
  auVar989._0_8_ = uVar1509;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uStack_1f0;
  auVar990._8_8_ = 0;
  auVar990._0_8_ = local_208;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = local_1e8;
  auVar991._8_8_ = 0;
  auVar991._0_8_ = uStack_210;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uStack_1e0;
  auVar992._8_8_ = 0;
  auVar992._0_8_ = local_218;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = local_1d8;
  auVar993._8_8_ = 0;
  auVar993._0_8_ = uVar1514;
  auVar1 = auVar334 * auVar990 + auVar1397 + auVar335 * auVar991 + auVar336 * auVar992 +
           auVar337 * auVar993;
  uVar1511 = auVar1._0_8_;
  auVar1399._8_8_ = 0;
  auVar1399._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar994._8_8_ = 0;
  auVar994._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar333 * auVar989 + ZEXT816(0x1000003d1) * auVar994;
  uVar1511 = auVar1._0_8_;
  local_228 = uVar1511 & 0xfffffffffffff;
  auVar1398._8_8_ = 0;
  auVar1398._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = local_1f8;
  auVar995._8_8_ = 0;
  auVar995._0_8_ = uVar1514;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uStack_1f0;
  auVar996._8_8_ = 0;
  auVar996._0_8_ = uVar1509;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = local_1e8;
  auVar997._8_8_ = 0;
  auVar997._0_8_ = local_208;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uStack_1e0;
  auVar998._8_8_ = 0;
  auVar998._0_8_ = uStack_210;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = local_1d8;
  auVar999._8_8_ = 0;
  auVar999._0_8_ = local_218;
  auVar2 = auVar340 * auVar997 + auVar1399 + auVar341 * auVar998 + auVar342 * auVar999;
  uVar1511 = auVar2._0_8_;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar338 * auVar995 + auVar1398 + auVar339 * auVar996 + auVar343 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1401._8_8_ = 0;
  auVar1401._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_220 = uVar1508 & 0xfffffffffffff;
  auVar1400._8_8_ = 0;
  auVar1400._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = local_1f8;
  auVar1000._8_8_ = 0;
  auVar1000._0_8_ = local_218;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uStack_1f0;
  auVar1001._8_8_ = 0;
  auVar1001._0_8_ = uVar1514;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = local_1e8;
  auVar1002._8_8_ = 0;
  auVar1002._0_8_ = uVar1509;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uStack_1e0;
  auVar1003._8_8_ = 0;
  auVar1003._0_8_ = local_208;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = local_1d8;
  auVar1004._8_8_ = 0;
  auVar1004._0_8_ = uStack_210;
  auVar2 = auVar347 * auVar1003 + auVar1401 + auVar348 * auVar1004;
  uVar1509 = auVar2._0_8_;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar344 * auVar1000 + auVar1400 + auVar345 * auVar1001 + auVar346 * auVar1002 +
           auVar349 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_218 = uVar1514 & 0xfffffffffffff;
  auVar1402._8_8_ = 0;
  auVar1402._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1402 = auVar350 * ZEXT816(0x1000003d10) + auVar1402;
  uVar1509 = auVar1402._0_8_;
  uStack_210 = uVar1509 & 0xfffffffffffff;
  local_208 = (uVar1509 >> 0x34 | auVar1402._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 0x2c;
  local_1c8 = local_228;
  uStack_1c0 = uStack_220;
  local_1b8 = local_218;
  uStack_1b0 = uStack_210;
  local_1a8 = local_208;
  do {
    auVar351._8_8_ = 0;
    auVar351._0_8_ = local_1c8 * 2;
    auVar1005._8_8_ = 0;
    auVar1005._0_8_ = uStack_1b0;
    auVar352._8_8_ = 0;
    auVar352._0_8_ = uStack_1c0 * 2;
    auVar1006._8_8_ = 0;
    auVar1006._0_8_ = local_1b8;
    auVar353._8_8_ = 0;
    auVar353._0_8_ = local_1a8;
    auVar1007._8_8_ = 0;
    auVar1007._0_8_ = local_1a8;
    uVar1509 = SUB168(auVar353 * auVar1007,0);
    auVar354._8_8_ = 0;
    auVar354._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar352 * auVar1006 + auVar351 * auVar1005 + auVar354 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1403._8_8_ = 0;
    auVar1403._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_1a8 = local_1a8 * 2;
    auVar355._8_8_ = 0;
    auVar355._0_8_ = local_1c8;
    auVar1008._8_8_ = 0;
    auVar1008._0_8_ = local_1a8;
    auVar356._8_8_ = 0;
    auVar356._0_8_ = uStack_1c0 * 2;
    auVar1009._8_8_ = 0;
    auVar1009._0_8_ = uStack_1b0;
    auVar357._8_8_ = 0;
    auVar357._0_8_ = local_1b8;
    auVar1010._8_8_ = 0;
    auVar1010._0_8_ = local_1b8;
    auVar358._8_8_ = 0;
    auVar358._0_8_ = uVar1509 >> 0x34 | SUB168(auVar353 * auVar1007,8) << 0xc;
    auVar1 = auVar355 * auVar1008 + auVar1403 + auVar356 * auVar1009 + auVar357 * auVar1010 +
             auVar358 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1404._8_8_ = 0;
    auVar1404._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar359._8_8_ = 0;
    auVar359._0_8_ = local_1c8;
    auVar1011._8_8_ = 0;
    auVar1011._0_8_ = local_1c8;
    auVar360._8_8_ = 0;
    auVar360._0_8_ = uStack_1c0;
    auVar1012._8_8_ = 0;
    auVar1012._0_8_ = local_1a8;
    auVar361._8_8_ = 0;
    auVar361._0_8_ = local_1b8 * 2;
    auVar1013._8_8_ = 0;
    auVar1013._0_8_ = uStack_1b0;
    auVar1 = auVar360 * auVar1012 + auVar1404 + auVar361 * auVar1013;
    uVar1509 = auVar1._0_8_;
    auVar1406._8_8_ = 0;
    auVar1406._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1014._8_8_ = 0;
    auVar1014._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar359 * auVar1011 + ZEXT816(0x1000003d1) * auVar1014;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1405._8_8_ = 0;
    auVar1405._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar362._8_8_ = 0;
    auVar362._0_8_ = local_1c8 * 2;
    auVar1015._8_8_ = 0;
    auVar1015._0_8_ = uStack_1c0;
    auVar363._8_8_ = 0;
    auVar363._0_8_ = local_1b8;
    auVar1016._8_8_ = 0;
    auVar1016._0_8_ = local_1a8;
    auVar364._8_8_ = 0;
    auVar364._0_8_ = uStack_1b0;
    auVar1017._8_8_ = 0;
    auVar1017._0_8_ = uStack_1b0;
    auVar2 = auVar363 * auVar1016 + auVar1406 + auVar364 * auVar1017;
    uVar1514 = auVar2._0_8_;
    auVar365._8_8_ = 0;
    auVar365._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar362 * auVar1015 + auVar1405 + auVar365 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1408._8_8_ = 0;
    auVar1408._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1407._8_8_ = 0;
    auVar1407._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar366._8_8_ = 0;
    auVar366._0_8_ = local_1c8 * 2;
    auVar1018._8_8_ = 0;
    auVar1018._0_8_ = local_1b8;
    auVar367._8_8_ = 0;
    auVar367._0_8_ = uStack_1c0;
    auVar1019._8_8_ = 0;
    auVar1019._0_8_ = uStack_1c0;
    auVar368._8_8_ = 0;
    auVar368._0_8_ = uStack_1b0;
    auVar1020._8_8_ = 0;
    auVar1020._0_8_ = local_1a8;
    auVar1408 = auVar368 * auVar1020 + auVar1408;
    uVar1511 = auVar1408._0_8_;
    auVar369._8_8_ = 0;
    auVar369._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar366 * auVar1018 + auVar1407 + auVar367 * auVar1019 +
             auVar369 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_1b8 = uVar1508 & 0xfffffffffffff;
    auVar1409._8_8_ = 0;
    auVar1409._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar370._8_8_ = 0;
    auVar370._0_8_ = uVar1511 >> 0x34 | auVar1408._8_8_ << 0xc;
    auVar1409 = auVar370 * ZEXT816(0x1000003d10) + auVar1409;
    uVar1518 = auVar1409._0_8_;
    uStack_1b0 = uVar1518 & 0xfffffffffffff;
    local_1a8 = (uVar1518 >> 0x34 | auVar1409._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_1c8 = uVar1509;
    uStack_1c0 = uVar1514;
  } while (iVar1515 != 0);
  auVar371._8_8_ = 0;
  auVar371._0_8_ = local_228;
  auVar1021._8_8_ = 0;
  auVar1021._0_8_ = uStack_1b0;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = uStack_220;
  auVar1022._8_8_ = 0;
  auVar1022._0_8_ = local_1b8;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = local_218;
  auVar1023._8_8_ = 0;
  auVar1023._0_8_ = uVar1514;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = uStack_210;
  auVar1024._8_8_ = 0;
  auVar1024._0_8_ = uVar1509;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = local_208;
  auVar1025._8_8_ = 0;
  auVar1025._0_8_ = local_1a8;
  uVar1518 = SUB168(auVar375 * auVar1025,0);
  auVar376._8_8_ = 0;
  auVar376._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar372 * auVar1022 + auVar371 * auVar1021 + auVar373 * auVar1023 + auVar374 * auVar1024
           + auVar376 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1410._8_8_ = 0;
  auVar1410._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = local_228;
  auVar1026._8_8_ = 0;
  auVar1026._0_8_ = local_1a8;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = uStack_220;
  auVar1027._8_8_ = 0;
  auVar1027._0_8_ = uStack_1b0;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = local_218;
  auVar1028._8_8_ = 0;
  auVar1028._0_8_ = local_1b8;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = uStack_210;
  auVar1029._8_8_ = 0;
  auVar1029._0_8_ = uVar1514;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = local_208;
  auVar1030._8_8_ = 0;
  auVar1030._0_8_ = uVar1509;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = uVar1518 >> 0x34 | SUB168(auVar375 * auVar1025,8) << 0xc;
  auVar1 = auVar377 * auVar1026 + auVar1410 + auVar378 * auVar1027 + auVar379 * auVar1028 +
           auVar380 * auVar1029 + auVar381 * auVar1030 + auVar382 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1411._8_8_ = 0;
  auVar1411._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = local_228;
  auVar1031._8_8_ = 0;
  auVar1031._0_8_ = uVar1509;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = uStack_220;
  auVar1032._8_8_ = 0;
  auVar1032._0_8_ = local_1a8;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = local_218;
  auVar1033._8_8_ = 0;
  auVar1033._0_8_ = uStack_1b0;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = uStack_210;
  auVar1034._8_8_ = 0;
  auVar1034._0_8_ = local_1b8;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = local_208;
  auVar1035._8_8_ = 0;
  auVar1035._0_8_ = uVar1514;
  auVar1 = auVar384 * auVar1032 + auVar1411 + auVar385 * auVar1033 + auVar386 * auVar1034 +
           auVar387 * auVar1035;
  uVar1511 = auVar1._0_8_;
  auVar1413._8_8_ = 0;
  auVar1413._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1036._8_8_ = 0;
  auVar1036._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar383 * auVar1031 + ZEXT816(0x1000003d1) * auVar1036;
  uVar1511 = auVar1._0_8_;
  local_1c8 = uVar1511 & 0xfffffffffffff;
  auVar1412._8_8_ = 0;
  auVar1412._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = local_228;
  auVar1037._8_8_ = 0;
  auVar1037._0_8_ = uVar1514;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = uStack_220;
  auVar1038._8_8_ = 0;
  auVar1038._0_8_ = uVar1509;
  auVar390._8_8_ = 0;
  auVar390._0_8_ = local_218;
  auVar1039._8_8_ = 0;
  auVar1039._0_8_ = local_1a8;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = uStack_210;
  auVar1040._8_8_ = 0;
  auVar1040._0_8_ = uStack_1b0;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = local_208;
  auVar1041._8_8_ = 0;
  auVar1041._0_8_ = local_1b8;
  auVar2 = auVar390 * auVar1039 + auVar1413 + auVar391 * auVar1040 + auVar392 * auVar1041;
  uVar1511 = auVar2._0_8_;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar388 * auVar1037 + auVar1412 + auVar389 * auVar1038 +
           auVar393 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1415._8_8_ = 0;
  auVar1415._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_1c0 = uVar1508 & 0xfffffffffffff;
  auVar1414._8_8_ = 0;
  auVar1414._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = local_228;
  auVar1042._8_8_ = 0;
  auVar1042._0_8_ = local_1b8;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = uStack_220;
  auVar1043._8_8_ = 0;
  auVar1043._0_8_ = uVar1514;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = local_218;
  auVar1044._8_8_ = 0;
  auVar1044._0_8_ = uVar1509;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = uStack_210;
  auVar1045._8_8_ = 0;
  auVar1045._0_8_ = local_1a8;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = local_208;
  auVar1046._8_8_ = 0;
  auVar1046._0_8_ = uStack_1b0;
  auVar2 = auVar397 * auVar1045 + auVar1415 + auVar398 * auVar1046;
  uVar1509 = auVar2._0_8_;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar394 * auVar1042 + auVar1414 + auVar395 * auVar1043 + auVar396 * auVar1044 +
           auVar399 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_1b8 = uVar1514 & 0xfffffffffffff;
  auVar1416._8_8_ = 0;
  auVar1416._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1416 = auVar400 * ZEXT816(0x1000003d10) + auVar1416;
  uVar1509 = auVar1416._0_8_;
  uStack_1b0 = uVar1509 & 0xfffffffffffff;
  local_1a8 = (uVar1509 >> 0x34 | auVar1416._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 0x58;
  local_108 = local_1c8;
  uStack_100 = uStack_1c0;
  local_f8 = local_1b8;
  uStack_f0 = uStack_1b0;
  local_e8 = local_1a8;
  do {
    auVar401._8_8_ = 0;
    auVar401._0_8_ = local_108 * 2;
    auVar1047._8_8_ = 0;
    auVar1047._0_8_ = uStack_f0;
    auVar402._8_8_ = 0;
    auVar402._0_8_ = uStack_100 * 2;
    auVar1048._8_8_ = 0;
    auVar1048._0_8_ = local_f8;
    auVar403._8_8_ = 0;
    auVar403._0_8_ = local_e8;
    auVar1049._8_8_ = 0;
    auVar1049._0_8_ = local_e8;
    uVar1509 = SUB168(auVar403 * auVar1049,0);
    auVar404._8_8_ = 0;
    auVar404._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar402 * auVar1048 + auVar401 * auVar1047 + auVar404 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1417._8_8_ = 0;
    auVar1417._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_e8 = local_e8 * 2;
    auVar405._8_8_ = 0;
    auVar405._0_8_ = local_108;
    auVar1050._8_8_ = 0;
    auVar1050._0_8_ = local_e8;
    auVar406._8_8_ = 0;
    auVar406._0_8_ = uStack_100 * 2;
    auVar1051._8_8_ = 0;
    auVar1051._0_8_ = uStack_f0;
    auVar407._8_8_ = 0;
    auVar407._0_8_ = local_f8;
    auVar1052._8_8_ = 0;
    auVar1052._0_8_ = local_f8;
    auVar408._8_8_ = 0;
    auVar408._0_8_ = uVar1509 >> 0x34 | SUB168(auVar403 * auVar1049,8) << 0xc;
    auVar1 = auVar405 * auVar1050 + auVar1417 + auVar406 * auVar1051 + auVar407 * auVar1052 +
             auVar408 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1418._8_8_ = 0;
    auVar1418._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar409._8_8_ = 0;
    auVar409._0_8_ = local_108;
    auVar1053._8_8_ = 0;
    auVar1053._0_8_ = local_108;
    auVar410._8_8_ = 0;
    auVar410._0_8_ = uStack_100;
    auVar1054._8_8_ = 0;
    auVar1054._0_8_ = local_e8;
    auVar411._8_8_ = 0;
    auVar411._0_8_ = local_f8 * 2;
    auVar1055._8_8_ = 0;
    auVar1055._0_8_ = uStack_f0;
    auVar1 = auVar410 * auVar1054 + auVar1418 + auVar411 * auVar1055;
    uVar1509 = auVar1._0_8_;
    auVar1420._8_8_ = 0;
    auVar1420._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1056._8_8_ = 0;
    auVar1056._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar409 * auVar1053 + ZEXT816(0x1000003d1) * auVar1056;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1419._8_8_ = 0;
    auVar1419._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar412._8_8_ = 0;
    auVar412._0_8_ = local_108 * 2;
    auVar1057._8_8_ = 0;
    auVar1057._0_8_ = uStack_100;
    auVar413._8_8_ = 0;
    auVar413._0_8_ = local_f8;
    auVar1058._8_8_ = 0;
    auVar1058._0_8_ = local_e8;
    auVar414._8_8_ = 0;
    auVar414._0_8_ = uStack_f0;
    auVar1059._8_8_ = 0;
    auVar1059._0_8_ = uStack_f0;
    auVar2 = auVar413 * auVar1058 + auVar1420 + auVar414 * auVar1059;
    uVar1514 = auVar2._0_8_;
    auVar415._8_8_ = 0;
    auVar415._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar412 * auVar1057 + auVar1419 + auVar415 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1422._8_8_ = 0;
    auVar1422._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1421._8_8_ = 0;
    auVar1421._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar416._8_8_ = 0;
    auVar416._0_8_ = local_108 * 2;
    auVar1060._8_8_ = 0;
    auVar1060._0_8_ = local_f8;
    auVar417._8_8_ = 0;
    auVar417._0_8_ = uStack_100;
    auVar1061._8_8_ = 0;
    auVar1061._0_8_ = uStack_100;
    auVar418._8_8_ = 0;
    auVar418._0_8_ = uStack_f0;
    auVar1062._8_8_ = 0;
    auVar1062._0_8_ = local_e8;
    auVar1422 = auVar418 * auVar1062 + auVar1422;
    uVar1511 = auVar1422._0_8_;
    auVar419._8_8_ = 0;
    auVar419._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar416 * auVar1060 + auVar1421 + auVar417 * auVar1061 +
             auVar419 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_f8 = uVar1508 & 0xfffffffffffff;
    auVar1423._8_8_ = 0;
    auVar1423._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar420._8_8_ = 0;
    auVar420._0_8_ = uVar1511 >> 0x34 | auVar1422._8_8_ << 0xc;
    auVar1423 = auVar420 * ZEXT816(0x1000003d10) + auVar1423;
    uVar1518 = auVar1423._0_8_;
    uStack_f0 = uVar1518 & 0xfffffffffffff;
    local_e8 = (uVar1518 >> 0x34 | auVar1423._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_108 = uVar1509;
    uStack_100 = uVar1514;
  } while (iVar1515 != 0);
  auVar421._8_8_ = 0;
  auVar421._0_8_ = local_1c8;
  auVar1063._8_8_ = 0;
  auVar1063._0_8_ = uStack_f0;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = uStack_1c0;
  auVar1064._8_8_ = 0;
  auVar1064._0_8_ = local_f8;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = local_1b8;
  auVar1065._8_8_ = 0;
  auVar1065._0_8_ = uVar1514;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = uStack_1b0;
  auVar1066._8_8_ = 0;
  auVar1066._0_8_ = uVar1509;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = local_1a8;
  auVar1067._8_8_ = 0;
  auVar1067._0_8_ = local_e8;
  uVar1518 = SUB168(auVar425 * auVar1067,0);
  auVar426._8_8_ = 0;
  auVar426._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar422 * auVar1064 + auVar421 * auVar1063 + auVar423 * auVar1065 + auVar424 * auVar1066
           + auVar426 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1424._8_8_ = 0;
  auVar1424._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = local_1c8;
  auVar1068._8_8_ = 0;
  auVar1068._0_8_ = local_e8;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = uStack_1c0;
  auVar1069._8_8_ = 0;
  auVar1069._0_8_ = uStack_f0;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = local_1b8;
  auVar1070._8_8_ = 0;
  auVar1070._0_8_ = local_f8;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = uStack_1b0;
  auVar1071._8_8_ = 0;
  auVar1071._0_8_ = uVar1514;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = local_1a8;
  auVar1072._8_8_ = 0;
  auVar1072._0_8_ = uVar1509;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = uVar1518 >> 0x34 | SUB168(auVar425 * auVar1067,8) << 0xc;
  auVar1 = auVar427 * auVar1068 + auVar1424 + auVar428 * auVar1069 + auVar429 * auVar1070 +
           auVar430 * auVar1071 + auVar431 * auVar1072 + auVar432 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1425._8_8_ = 0;
  auVar1425._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = local_1c8;
  auVar1073._8_8_ = 0;
  auVar1073._0_8_ = uVar1509;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = uStack_1c0;
  auVar1074._8_8_ = 0;
  auVar1074._0_8_ = local_e8;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = local_1b8;
  auVar1075._8_8_ = 0;
  auVar1075._0_8_ = uStack_f0;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = uStack_1b0;
  auVar1076._8_8_ = 0;
  auVar1076._0_8_ = local_f8;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = local_1a8;
  auVar1077._8_8_ = 0;
  auVar1077._0_8_ = uVar1514;
  auVar1 = auVar434 * auVar1074 + auVar1425 + auVar435 * auVar1075 + auVar436 * auVar1076 +
           auVar437 * auVar1077;
  uVar1511 = auVar1._0_8_;
  auVar1427._8_8_ = 0;
  auVar1427._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1078._8_8_ = 0;
  auVar1078._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar433 * auVar1073 + ZEXT816(0x1000003d1) * auVar1078;
  uVar1511 = auVar1._0_8_;
  local_108 = uVar1511 & 0xfffffffffffff;
  auVar1426._8_8_ = 0;
  auVar1426._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = local_1c8;
  auVar1079._8_8_ = 0;
  auVar1079._0_8_ = uVar1514;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = uStack_1c0;
  auVar1080._8_8_ = 0;
  auVar1080._0_8_ = uVar1509;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = local_1b8;
  auVar1081._8_8_ = 0;
  auVar1081._0_8_ = local_e8;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = uStack_1b0;
  auVar1082._8_8_ = 0;
  auVar1082._0_8_ = uStack_f0;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = local_1a8;
  auVar1083._8_8_ = 0;
  auVar1083._0_8_ = local_f8;
  auVar2 = auVar440 * auVar1081 + auVar1427 + auVar441 * auVar1082 + auVar442 * auVar1083;
  uVar1511 = auVar2._0_8_;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar438 * auVar1079 + auVar1426 + auVar439 * auVar1080 +
           auVar443 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1429._8_8_ = 0;
  auVar1429._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_100 = uVar1508 & 0xfffffffffffff;
  auVar1428._8_8_ = 0;
  auVar1428._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = local_1c8;
  auVar1084._8_8_ = 0;
  auVar1084._0_8_ = local_f8;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uStack_1c0;
  auVar1085._8_8_ = 0;
  auVar1085._0_8_ = uVar1514;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = local_1b8;
  auVar1086._8_8_ = 0;
  auVar1086._0_8_ = uVar1509;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uStack_1b0;
  auVar1087._8_8_ = 0;
  auVar1087._0_8_ = local_e8;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = local_1a8;
  auVar1088._8_8_ = 0;
  auVar1088._0_8_ = uStack_f0;
  auVar2 = auVar447 * auVar1087 + auVar1429 + auVar448 * auVar1088;
  uVar1509 = auVar2._0_8_;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar444 * auVar1084 + auVar1428 + auVar445 * auVar1085 + auVar446 * auVar1086 +
           auVar449 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_f8 = uVar1514 & 0xfffffffffffff;
  auVar1430._8_8_ = 0;
  auVar1430._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1430 = auVar450 * ZEXT816(0x1000003d10) + auVar1430;
  uVar1509 = auVar1430._0_8_;
  uStack_f0 = uVar1509 & 0xfffffffffffff;
  local_e8 = (uVar1509 >> 0x34 | auVar1430._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 0x2c;
  local_138 = local_108;
  uStack_130 = uStack_100;
  local_128 = local_f8;
  uStack_120 = uStack_f0;
  local_118 = local_e8;
  do {
    auVar451._8_8_ = 0;
    auVar451._0_8_ = local_138 * 2;
    auVar1089._8_8_ = 0;
    auVar1089._0_8_ = uStack_120;
    auVar452._8_8_ = 0;
    auVar452._0_8_ = uStack_130 * 2;
    auVar1090._8_8_ = 0;
    auVar1090._0_8_ = local_128;
    auVar453._8_8_ = 0;
    auVar453._0_8_ = local_118;
    auVar1091._8_8_ = 0;
    auVar1091._0_8_ = local_118;
    uVar1509 = SUB168(auVar453 * auVar1091,0);
    auVar454._8_8_ = 0;
    auVar454._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar452 * auVar1090 + auVar451 * auVar1089 + auVar454 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1431._8_8_ = 0;
    auVar1431._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_118 = local_118 * 2;
    auVar455._8_8_ = 0;
    auVar455._0_8_ = local_138;
    auVar1092._8_8_ = 0;
    auVar1092._0_8_ = local_118;
    auVar456._8_8_ = 0;
    auVar456._0_8_ = uStack_130 * 2;
    auVar1093._8_8_ = 0;
    auVar1093._0_8_ = uStack_120;
    auVar457._8_8_ = 0;
    auVar457._0_8_ = local_128;
    auVar1094._8_8_ = 0;
    auVar1094._0_8_ = local_128;
    auVar458._8_8_ = 0;
    auVar458._0_8_ = uVar1509 >> 0x34 | SUB168(auVar453 * auVar1091,8) << 0xc;
    auVar1 = auVar455 * auVar1092 + auVar1431 + auVar456 * auVar1093 + auVar457 * auVar1094 +
             auVar458 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1432._8_8_ = 0;
    auVar1432._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar459._8_8_ = 0;
    auVar459._0_8_ = local_138;
    auVar1095._8_8_ = 0;
    auVar1095._0_8_ = local_138;
    auVar460._8_8_ = 0;
    auVar460._0_8_ = uStack_130;
    auVar1096._8_8_ = 0;
    auVar1096._0_8_ = local_118;
    auVar461._8_8_ = 0;
    auVar461._0_8_ = local_128 * 2;
    auVar1097._8_8_ = 0;
    auVar1097._0_8_ = uStack_120;
    auVar1 = auVar460 * auVar1096 + auVar1432 + auVar461 * auVar1097;
    uVar1509 = auVar1._0_8_;
    auVar1434._8_8_ = 0;
    auVar1434._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1098._8_8_ = 0;
    auVar1098._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar459 * auVar1095 + ZEXT816(0x1000003d1) * auVar1098;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1433._8_8_ = 0;
    auVar1433._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar462._8_8_ = 0;
    auVar462._0_8_ = local_138 * 2;
    auVar1099._8_8_ = 0;
    auVar1099._0_8_ = uStack_130;
    auVar463._8_8_ = 0;
    auVar463._0_8_ = local_128;
    auVar1100._8_8_ = 0;
    auVar1100._0_8_ = local_118;
    auVar464._8_8_ = 0;
    auVar464._0_8_ = uStack_120;
    auVar1101._8_8_ = 0;
    auVar1101._0_8_ = uStack_120;
    auVar2 = auVar463 * auVar1100 + auVar1434 + auVar464 * auVar1101;
    uVar1514 = auVar2._0_8_;
    auVar465._8_8_ = 0;
    auVar465._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar462 * auVar1099 + auVar1433 + auVar465 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1436._8_8_ = 0;
    auVar1436._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1435._8_8_ = 0;
    auVar1435._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar466._8_8_ = 0;
    auVar466._0_8_ = local_138 * 2;
    auVar1102._8_8_ = 0;
    auVar1102._0_8_ = local_128;
    auVar467._8_8_ = 0;
    auVar467._0_8_ = uStack_130;
    auVar1103._8_8_ = 0;
    auVar1103._0_8_ = uStack_130;
    auVar468._8_8_ = 0;
    auVar468._0_8_ = uStack_120;
    auVar1104._8_8_ = 0;
    auVar1104._0_8_ = local_118;
    auVar1436 = auVar468 * auVar1104 + auVar1436;
    uVar1511 = auVar1436._0_8_;
    auVar469._8_8_ = 0;
    auVar469._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar466 * auVar1102 + auVar1435 + auVar467 * auVar1103 +
             auVar469 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_128 = uVar1508 & 0xfffffffffffff;
    auVar1437._8_8_ = 0;
    auVar1437._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar470._8_8_ = 0;
    auVar470._0_8_ = uVar1511 >> 0x34 | auVar1436._8_8_ << 0xc;
    auVar1437 = auVar470 * ZEXT816(0x1000003d10) + auVar1437;
    uVar1518 = auVar1437._0_8_;
    uStack_120 = uVar1518 & 0xfffffffffffff;
    local_118 = (uVar1518 >> 0x34 | auVar1437._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_138 = uVar1509;
    uStack_130 = uVar1514;
  } while (iVar1515 != 0);
  auVar471._8_8_ = 0;
  auVar471._0_8_ = local_228;
  auVar1105._8_8_ = 0;
  auVar1105._0_8_ = uStack_120;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uStack_220;
  auVar1106._8_8_ = 0;
  auVar1106._0_8_ = local_128;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = local_218;
  auVar1107._8_8_ = 0;
  auVar1107._0_8_ = uVar1514;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = uStack_210;
  auVar1108._8_8_ = 0;
  auVar1108._0_8_ = uVar1509;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = local_208;
  auVar1109._8_8_ = 0;
  auVar1109._0_8_ = local_118;
  uVar1518 = SUB168(auVar475 * auVar1109,0);
  auVar476._8_8_ = 0;
  auVar476._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar472 * auVar1106 + auVar471 * auVar1105 + auVar473 * auVar1107 + auVar474 * auVar1108
           + auVar476 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1438._8_8_ = 0;
  auVar1438._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = local_228;
  auVar1110._8_8_ = 0;
  auVar1110._0_8_ = local_118;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = uStack_220;
  auVar1111._8_8_ = 0;
  auVar1111._0_8_ = uStack_120;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = local_218;
  auVar1112._8_8_ = 0;
  auVar1112._0_8_ = local_128;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = uStack_210;
  auVar1113._8_8_ = 0;
  auVar1113._0_8_ = uVar1514;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = local_208;
  auVar1114._8_8_ = 0;
  auVar1114._0_8_ = uVar1509;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = uVar1518 >> 0x34 | SUB168(auVar475 * auVar1109,8) << 0xc;
  auVar1 = auVar477 * auVar1110 + auVar1438 + auVar478 * auVar1111 + auVar479 * auVar1112 +
           auVar480 * auVar1113 + auVar481 * auVar1114 + auVar482 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1439._8_8_ = 0;
  auVar1439._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = local_228;
  auVar1115._8_8_ = 0;
  auVar1115._0_8_ = uVar1509;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = uStack_220;
  auVar1116._8_8_ = 0;
  auVar1116._0_8_ = local_118;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = local_218;
  auVar1117._8_8_ = 0;
  auVar1117._0_8_ = uStack_120;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uStack_210;
  auVar1118._8_8_ = 0;
  auVar1118._0_8_ = local_128;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = local_208;
  auVar1119._8_8_ = 0;
  auVar1119._0_8_ = uVar1514;
  auVar1 = auVar484 * auVar1116 + auVar1439 + auVar485 * auVar1117 + auVar486 * auVar1118 +
           auVar487 * auVar1119;
  uVar1511 = auVar1._0_8_;
  auVar1441._8_8_ = 0;
  auVar1441._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1120._8_8_ = 0;
  auVar1120._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar483 * auVar1115 + ZEXT816(0x1000003d1) * auVar1120;
  uVar1511 = auVar1._0_8_;
  local_138 = uVar1511 & 0xfffffffffffff;
  auVar1440._8_8_ = 0;
  auVar1440._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = local_228;
  auVar1121._8_8_ = 0;
  auVar1121._0_8_ = uVar1514;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uStack_220;
  auVar1122._8_8_ = 0;
  auVar1122._0_8_ = uVar1509;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = local_218;
  auVar1123._8_8_ = 0;
  auVar1123._0_8_ = local_118;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uStack_210;
  auVar1124._8_8_ = 0;
  auVar1124._0_8_ = uStack_120;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = local_208;
  auVar1125._8_8_ = 0;
  auVar1125._0_8_ = local_128;
  auVar2 = auVar490 * auVar1123 + auVar1441 + auVar491 * auVar1124 + auVar492 * auVar1125;
  uVar1511 = auVar2._0_8_;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar488 * auVar1121 + auVar1440 + auVar489 * auVar1122 +
           auVar493 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1443._8_8_ = 0;
  auVar1443._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_130 = uVar1508 & 0xfffffffffffff;
  auVar1442._8_8_ = 0;
  auVar1442._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = local_228;
  auVar1126._8_8_ = 0;
  auVar1126._0_8_ = local_128;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = uStack_220;
  auVar1127._8_8_ = 0;
  auVar1127._0_8_ = uVar1514;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = local_218;
  auVar1128._8_8_ = 0;
  auVar1128._0_8_ = uVar1509;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uStack_210;
  auVar1129._8_8_ = 0;
  auVar1129._0_8_ = local_118;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = local_208;
  auVar1130._8_8_ = 0;
  auVar1130._0_8_ = uStack_120;
  auVar2 = auVar497 * auVar1129 + auVar1443 + auVar498 * auVar1130;
  uVar1509 = auVar2._0_8_;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar494 * auVar1126 + auVar1442 + auVar495 * auVar1127 + auVar496 * auVar1128 +
           auVar499 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_128 = uVar1514 & 0xfffffffffffff;
  auVar1444._8_8_ = 0;
  auVar1444._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar500._8_8_ = 0;
  auVar500._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1444 = auVar500 * ZEXT816(0x1000003d10) + auVar1444;
  uVar1509 = auVar1444._0_8_;
  uStack_120 = uVar1509 & 0xfffffffffffff;
  local_118 = (uVar1509 >> 0x34 | auVar1444._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 3;
  local_168 = local_138;
  uStack_160 = uStack_130;
  local_158 = local_128;
  uStack_150 = uStack_120;
  local_148 = local_118;
  do {
    auVar501._8_8_ = 0;
    auVar501._0_8_ = local_168 * 2;
    auVar1131._8_8_ = 0;
    auVar1131._0_8_ = uStack_150;
    auVar502._8_8_ = 0;
    auVar502._0_8_ = uStack_160 * 2;
    auVar1132._8_8_ = 0;
    auVar1132._0_8_ = local_158;
    auVar503._8_8_ = 0;
    auVar503._0_8_ = local_148;
    auVar1133._8_8_ = 0;
    auVar1133._0_8_ = local_148;
    uVar1509 = SUB168(auVar503 * auVar1133,0);
    auVar504._8_8_ = 0;
    auVar504._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar502 * auVar1132 + auVar501 * auVar1131 + auVar504 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1445._8_8_ = 0;
    auVar1445._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_148 = local_148 * 2;
    auVar505._8_8_ = 0;
    auVar505._0_8_ = local_168;
    auVar1134._8_8_ = 0;
    auVar1134._0_8_ = local_148;
    auVar506._8_8_ = 0;
    auVar506._0_8_ = uStack_160 * 2;
    auVar1135._8_8_ = 0;
    auVar1135._0_8_ = uStack_150;
    auVar507._8_8_ = 0;
    auVar507._0_8_ = local_158;
    auVar1136._8_8_ = 0;
    auVar1136._0_8_ = local_158;
    auVar508._8_8_ = 0;
    auVar508._0_8_ = uVar1509 >> 0x34 | SUB168(auVar503 * auVar1133,8) << 0xc;
    auVar1 = auVar505 * auVar1134 + auVar1445 + auVar506 * auVar1135 + auVar507 * auVar1136 +
             auVar508 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1446._8_8_ = 0;
    auVar1446._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar509._8_8_ = 0;
    auVar509._0_8_ = local_168;
    auVar1137._8_8_ = 0;
    auVar1137._0_8_ = local_168;
    auVar510._8_8_ = 0;
    auVar510._0_8_ = uStack_160;
    auVar1138._8_8_ = 0;
    auVar1138._0_8_ = local_148;
    auVar511._8_8_ = 0;
    auVar511._0_8_ = local_158 * 2;
    auVar1139._8_8_ = 0;
    auVar1139._0_8_ = uStack_150;
    auVar1 = auVar510 * auVar1138 + auVar1446 + auVar511 * auVar1139;
    uVar1509 = auVar1._0_8_;
    auVar1448._8_8_ = 0;
    auVar1448._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1140._8_8_ = 0;
    auVar1140._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar509 * auVar1137 + ZEXT816(0x1000003d1) * auVar1140;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1447._8_8_ = 0;
    auVar1447._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar512._8_8_ = 0;
    auVar512._0_8_ = local_168 * 2;
    auVar1141._8_8_ = 0;
    auVar1141._0_8_ = uStack_160;
    auVar513._8_8_ = 0;
    auVar513._0_8_ = local_158;
    auVar1142._8_8_ = 0;
    auVar1142._0_8_ = local_148;
    auVar514._8_8_ = 0;
    auVar514._0_8_ = uStack_150;
    auVar1143._8_8_ = 0;
    auVar1143._0_8_ = uStack_150;
    auVar2 = auVar513 * auVar1142 + auVar1448 + auVar514 * auVar1143;
    uVar1514 = auVar2._0_8_;
    auVar515._8_8_ = 0;
    auVar515._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar512 * auVar1141 + auVar1447 + auVar515 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1450._8_8_ = 0;
    auVar1450._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1449._8_8_ = 0;
    auVar1449._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar516._8_8_ = 0;
    auVar516._0_8_ = local_168 * 2;
    auVar1144._8_8_ = 0;
    auVar1144._0_8_ = local_158;
    auVar517._8_8_ = 0;
    auVar517._0_8_ = uStack_160;
    auVar1145._8_8_ = 0;
    auVar1145._0_8_ = uStack_160;
    auVar518._8_8_ = 0;
    auVar518._0_8_ = uStack_150;
    auVar1146._8_8_ = 0;
    auVar1146._0_8_ = local_148;
    auVar1450 = auVar518 * auVar1146 + auVar1450;
    uVar1511 = auVar1450._0_8_;
    auVar519._8_8_ = 0;
    auVar519._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar516 * auVar1144 + auVar1449 + auVar517 * auVar1145 +
             auVar519 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_158 = uVar1508 & 0xfffffffffffff;
    auVar1451._8_8_ = 0;
    auVar1451._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar520._8_8_ = 0;
    auVar520._0_8_ = uVar1511 >> 0x34 | auVar1450._8_8_ << 0xc;
    auVar1451 = auVar520 * ZEXT816(0x1000003d10) + auVar1451;
    uVar1518 = auVar1451._0_8_;
    uStack_150 = uVar1518 & 0xfffffffffffff;
    local_148 = (uVar1518 >> 0x34 | auVar1451._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_168 = uVar1509;
    uStack_160 = uVar1514;
  } while (iVar1515 != 0);
  auVar521._8_8_ = 0;
  auVar521._0_8_ = local_80;
  auVar1147._8_8_ = 0;
  auVar1147._0_8_ = uStack_150;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = uStack_78;
  auVar1148._8_8_ = 0;
  auVar1148._0_8_ = local_158;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = local_70;
  auVar1149._8_8_ = 0;
  auVar1149._0_8_ = uVar1514;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = uStack_68;
  auVar1150._8_8_ = 0;
  auVar1150._0_8_ = uVar1509;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = local_60;
  auVar1151._8_8_ = 0;
  auVar1151._0_8_ = local_148;
  uVar1518 = SUB168(auVar525 * auVar1151,0);
  auVar526._8_8_ = 0;
  auVar526._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar522 * auVar1148 + auVar521 * auVar1147 + auVar523 * auVar1149 + auVar524 * auVar1150
           + auVar526 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1452._8_8_ = 0;
  auVar1452._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar527._8_8_ = 0;
  auVar527._0_8_ = local_80;
  auVar1152._8_8_ = 0;
  auVar1152._0_8_ = local_148;
  auVar528._8_8_ = 0;
  auVar528._0_8_ = uStack_78;
  auVar1153._8_8_ = 0;
  auVar1153._0_8_ = uStack_150;
  auVar529._8_8_ = 0;
  auVar529._0_8_ = local_70;
  auVar1154._8_8_ = 0;
  auVar1154._0_8_ = local_158;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = uStack_68;
  auVar1155._8_8_ = 0;
  auVar1155._0_8_ = uVar1514;
  auVar531._8_8_ = 0;
  auVar531._0_8_ = local_60;
  auVar1156._8_8_ = 0;
  auVar1156._0_8_ = uVar1509;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = uVar1518 >> 0x34 | SUB168(auVar525 * auVar1151,8) << 0xc;
  auVar1 = auVar527 * auVar1152 + auVar1452 + auVar528 * auVar1153 + auVar529 * auVar1154 +
           auVar530 * auVar1155 + auVar531 * auVar1156 + auVar532 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1453._8_8_ = 0;
  auVar1453._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = local_80;
  auVar1157._8_8_ = 0;
  auVar1157._0_8_ = uVar1509;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = uStack_78;
  auVar1158._8_8_ = 0;
  auVar1158._0_8_ = local_148;
  auVar535._8_8_ = 0;
  auVar535._0_8_ = local_70;
  auVar1159._8_8_ = 0;
  auVar1159._0_8_ = uStack_150;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = uStack_68;
  auVar1160._8_8_ = 0;
  auVar1160._0_8_ = local_158;
  auVar537._8_8_ = 0;
  auVar537._0_8_ = local_60;
  auVar1161._8_8_ = 0;
  auVar1161._0_8_ = uVar1514;
  auVar1 = auVar534 * auVar1158 + auVar1453 + auVar535 * auVar1159 + auVar536 * auVar1160 +
           auVar537 * auVar1161;
  uVar1511 = auVar1._0_8_;
  auVar1455._8_8_ = 0;
  auVar1455._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1162._8_8_ = 0;
  auVar1162._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar533 * auVar1157 + ZEXT816(0x1000003d1) * auVar1162;
  uVar1511 = auVar1._0_8_;
  local_168 = uVar1511 & 0xfffffffffffff;
  auVar1454._8_8_ = 0;
  auVar1454._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = local_80;
  auVar1163._8_8_ = 0;
  auVar1163._0_8_ = uVar1514;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = uStack_78;
  auVar1164._8_8_ = 0;
  auVar1164._0_8_ = uVar1509;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = local_70;
  auVar1165._8_8_ = 0;
  auVar1165._0_8_ = local_148;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = uStack_68;
  auVar1166._8_8_ = 0;
  auVar1166._0_8_ = uStack_150;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = local_60;
  auVar1167._8_8_ = 0;
  auVar1167._0_8_ = local_158;
  auVar2 = auVar540 * auVar1165 + auVar1455 + auVar541 * auVar1166 + auVar542 * auVar1167;
  uVar1511 = auVar2._0_8_;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar538 * auVar1163 + auVar1454 + auVar539 * auVar1164 +
           auVar543 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1457._8_8_ = 0;
  auVar1457._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_160 = uVar1508 & 0xfffffffffffff;
  auVar1456._8_8_ = 0;
  auVar1456._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = local_80;
  auVar1168._8_8_ = 0;
  auVar1168._0_8_ = local_158;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = uStack_78;
  auVar1169._8_8_ = 0;
  auVar1169._0_8_ = uVar1514;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = local_70;
  auVar1170._8_8_ = 0;
  auVar1170._0_8_ = uVar1509;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = uStack_68;
  auVar1171._8_8_ = 0;
  auVar1171._0_8_ = local_148;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = local_60;
  auVar1172._8_8_ = 0;
  auVar1172._0_8_ = uStack_150;
  auVar2 = auVar547 * auVar1171 + auVar1457 + auVar548 * auVar1172;
  uVar1509 = auVar2._0_8_;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar544 * auVar1168 + auVar1456 + auVar545 * auVar1169 + auVar546 * auVar1170 +
           auVar549 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_158 = uVar1514 & 0xfffffffffffff;
  auVar1458._8_8_ = 0;
  auVar1458._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar550._8_8_ = 0;
  auVar550._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1458 = auVar550 * ZEXT816(0x1000003d10) + auVar1458;
  uVar1509 = auVar1458._0_8_;
  uStack_150 = uVar1509 & 0xfffffffffffff;
  local_148 = (uVar1509 >> 0x34 | auVar1458._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 0x17;
  local_258 = local_168;
  uStack_250 = uStack_160;
  local_248 = local_158;
  uStack_240 = uStack_150;
  local_238 = local_148;
  do {
    auVar551._8_8_ = 0;
    auVar551._0_8_ = local_258 * 2;
    auVar1173._8_8_ = 0;
    auVar1173._0_8_ = uStack_240;
    auVar552._8_8_ = 0;
    auVar552._0_8_ = uStack_250 * 2;
    auVar1174._8_8_ = 0;
    auVar1174._0_8_ = local_248;
    auVar553._8_8_ = 0;
    auVar553._0_8_ = local_238;
    auVar1175._8_8_ = 0;
    auVar1175._0_8_ = local_238;
    uVar1509 = SUB168(auVar553 * auVar1175,0);
    auVar554._8_8_ = 0;
    auVar554._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar552 * auVar1174 + auVar551 * auVar1173 + auVar554 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1459._8_8_ = 0;
    auVar1459._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_238 = local_238 * 2;
    auVar555._8_8_ = 0;
    auVar555._0_8_ = local_258;
    auVar1176._8_8_ = 0;
    auVar1176._0_8_ = local_238;
    auVar556._8_8_ = 0;
    auVar556._0_8_ = uStack_250 * 2;
    auVar1177._8_8_ = 0;
    auVar1177._0_8_ = uStack_240;
    auVar557._8_8_ = 0;
    auVar557._0_8_ = local_248;
    auVar1178._8_8_ = 0;
    auVar1178._0_8_ = local_248;
    auVar558._8_8_ = 0;
    auVar558._0_8_ = uVar1509 >> 0x34 | SUB168(auVar553 * auVar1175,8) << 0xc;
    auVar1 = auVar555 * auVar1176 + auVar1459 + auVar556 * auVar1177 + auVar557 * auVar1178 +
             auVar558 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1460._8_8_ = 0;
    auVar1460._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar559._8_8_ = 0;
    auVar559._0_8_ = local_258;
    auVar1179._8_8_ = 0;
    auVar1179._0_8_ = local_258;
    auVar560._8_8_ = 0;
    auVar560._0_8_ = uStack_250;
    auVar1180._8_8_ = 0;
    auVar1180._0_8_ = local_238;
    auVar561._8_8_ = 0;
    auVar561._0_8_ = local_248 * 2;
    auVar1181._8_8_ = 0;
    auVar1181._0_8_ = uStack_240;
    auVar1 = auVar560 * auVar1180 + auVar1460 + auVar561 * auVar1181;
    uVar1509 = auVar1._0_8_;
    auVar1462._8_8_ = 0;
    auVar1462._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1182._8_8_ = 0;
    auVar1182._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar559 * auVar1179 + ZEXT816(0x1000003d1) * auVar1182;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1461._8_8_ = 0;
    auVar1461._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar562._8_8_ = 0;
    auVar562._0_8_ = local_258 * 2;
    auVar1183._8_8_ = 0;
    auVar1183._0_8_ = uStack_250;
    auVar563._8_8_ = 0;
    auVar563._0_8_ = local_248;
    auVar1184._8_8_ = 0;
    auVar1184._0_8_ = local_238;
    auVar564._8_8_ = 0;
    auVar564._0_8_ = uStack_240;
    auVar1185._8_8_ = 0;
    auVar1185._0_8_ = uStack_240;
    auVar2 = auVar563 * auVar1184 + auVar1462 + auVar564 * auVar1185;
    uVar1514 = auVar2._0_8_;
    auVar565._8_8_ = 0;
    auVar565._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar562 * auVar1183 + auVar1461 + auVar565 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1464._8_8_ = 0;
    auVar1464._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1463._8_8_ = 0;
    auVar1463._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar566._8_8_ = 0;
    auVar566._0_8_ = local_258 * 2;
    auVar1186._8_8_ = 0;
    auVar1186._0_8_ = local_248;
    auVar567._8_8_ = 0;
    auVar567._0_8_ = uStack_250;
    auVar1187._8_8_ = 0;
    auVar1187._0_8_ = uStack_250;
    auVar568._8_8_ = 0;
    auVar568._0_8_ = uStack_240;
    auVar1188._8_8_ = 0;
    auVar1188._0_8_ = local_238;
    auVar1464 = auVar568 * auVar1188 + auVar1464;
    uVar1511 = auVar1464._0_8_;
    auVar569._8_8_ = 0;
    auVar569._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar566 * auVar1186 + auVar1463 + auVar567 * auVar1187 +
             auVar569 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_248 = uVar1508 & 0xfffffffffffff;
    auVar1465._8_8_ = 0;
    auVar1465._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar570._8_8_ = 0;
    auVar570._0_8_ = uVar1511 >> 0x34 | auVar1464._8_8_ << 0xc;
    auVar1465 = auVar570 * ZEXT816(0x1000003d10) + auVar1465;
    uVar1518 = auVar1465._0_8_;
    uStack_240 = uVar1518 & 0xfffffffffffff;
    local_238 = (uVar1518 >> 0x34 | auVar1465._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_258 = uVar1509;
    uStack_250 = uVar1514;
  } while (iVar1515 != 0);
  auVar571._8_8_ = 0;
  auVar571._0_8_ = local_1f8;
  auVar1189._8_8_ = 0;
  auVar1189._0_8_ = uStack_240;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = uStack_1f0;
  auVar1190._8_8_ = 0;
  auVar1190._0_8_ = local_248;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = local_1e8;
  auVar1191._8_8_ = 0;
  auVar1191._0_8_ = uVar1514;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = uStack_1e0;
  auVar1192._8_8_ = 0;
  auVar1192._0_8_ = uVar1509;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = local_1d8;
  auVar1193._8_8_ = 0;
  auVar1193._0_8_ = local_238;
  uVar1518 = SUB168(auVar575 * auVar1193,0);
  auVar576._8_8_ = 0;
  auVar576._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar572 * auVar1190 + auVar571 * auVar1189 + auVar573 * auVar1191 + auVar574 * auVar1192
           + auVar576 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1466._8_8_ = 0;
  auVar1466._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = local_1f8;
  auVar1194._8_8_ = 0;
  auVar1194._0_8_ = local_238;
  auVar578._8_8_ = 0;
  auVar578._0_8_ = uStack_1f0;
  auVar1195._8_8_ = 0;
  auVar1195._0_8_ = uStack_240;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = local_1e8;
  auVar1196._8_8_ = 0;
  auVar1196._0_8_ = local_248;
  auVar580._8_8_ = 0;
  auVar580._0_8_ = uStack_1e0;
  auVar1197._8_8_ = 0;
  auVar1197._0_8_ = uVar1514;
  auVar581._8_8_ = 0;
  auVar581._0_8_ = local_1d8;
  auVar1198._8_8_ = 0;
  auVar1198._0_8_ = uVar1509;
  auVar582._8_8_ = 0;
  auVar582._0_8_ = uVar1518 >> 0x34 | SUB168(auVar575 * auVar1193,8) << 0xc;
  auVar1 = auVar577 * auVar1194 + auVar1466 + auVar578 * auVar1195 + auVar579 * auVar1196 +
           auVar580 * auVar1197 + auVar581 * auVar1198 + auVar582 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  auVar1467._8_8_ = 0;
  auVar1467._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar583._8_8_ = 0;
  auVar583._0_8_ = local_1f8;
  auVar1199._8_8_ = 0;
  auVar1199._0_8_ = uVar1509;
  auVar584._8_8_ = 0;
  auVar584._0_8_ = uStack_1f0;
  auVar1200._8_8_ = 0;
  auVar1200._0_8_ = local_238;
  auVar585._8_8_ = 0;
  auVar585._0_8_ = local_1e8;
  auVar1201._8_8_ = 0;
  auVar1201._0_8_ = uStack_240;
  auVar586._8_8_ = 0;
  auVar586._0_8_ = uStack_1e0;
  auVar1202._8_8_ = 0;
  auVar1202._0_8_ = local_248;
  auVar587._8_8_ = 0;
  auVar587._0_8_ = local_1d8;
  auVar1203._8_8_ = 0;
  auVar1203._0_8_ = uVar1514;
  auVar1 = auVar584 * auVar1200 + auVar1467 + auVar585 * auVar1201 + auVar586 * auVar1202 +
           auVar587 * auVar1203;
  uVar1511 = auVar1._0_8_;
  auVar1469._8_8_ = 0;
  auVar1469._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1204._8_8_ = 0;
  auVar1204._0_8_ = (uVar1511 & 0xfffffffffffff) << 4 | (uVar1518 & 0xfffffffffffff) >> 0x30;
  uVar1508 = auVar601._0_8_;
  auVar601 = auVar583 * auVar1199 + ZEXT816(0x1000003d1) * auVar1204;
  auVar1468._8_8_ = 0;
  auVar1468._0_8_ = uVar1508 >> 0x34 | auVar601._8_8_ << 0xc;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = local_1f8;
  auVar1205._8_8_ = 0;
  auVar1205._0_8_ = uVar1514;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = uStack_1f0;
  auVar1206._8_8_ = 0;
  auVar1206._0_8_ = uVar1509;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = local_1e8;
  auVar1207._8_8_ = 0;
  auVar1207._0_8_ = local_238;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = uStack_1e0;
  auVar1208._8_8_ = 0;
  auVar1208._0_8_ = uStack_240;
  auVar592._8_8_ = 0;
  auVar592._0_8_ = local_1d8;
  auVar1209._8_8_ = 0;
  auVar1209._0_8_ = local_248;
  auVar2 = auVar590 * auVar1207 + auVar1469 + auVar591 * auVar1208 + auVar592 * auVar1209;
  uVar1511 = auVar2._0_8_;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = uVar1511 & 0xfffffffffffff;
  auVar1 = auVar588 * auVar1205 + auVar1468 + auVar589 * auVar1206 +
           auVar593 * ZEXT816(0x1000003d10);
  uVar1516 = auVar1._0_8_;
  auVar1471._8_8_ = 0;
  auVar1471._0_8_ = uVar1511 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1470._8_8_ = 0;
  auVar1470._0_8_ = uVar1516 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = local_1f8;
  auVar1210._8_8_ = 0;
  auVar1210._0_8_ = local_248;
  auVar595._8_8_ = 0;
  auVar595._0_8_ = uStack_1f0;
  auVar1211._8_8_ = 0;
  auVar1211._0_8_ = uVar1514;
  auVar596._8_8_ = 0;
  auVar596._0_8_ = local_1e8;
  auVar1212._8_8_ = 0;
  auVar1212._0_8_ = uVar1509;
  auVar597._8_8_ = 0;
  auVar597._0_8_ = uStack_1e0;
  auVar1213._8_8_ = 0;
  auVar1213._0_8_ = local_238;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = local_1d8;
  auVar1214._8_8_ = 0;
  auVar1214._0_8_ = uStack_240;
  auVar2 = auVar597 * auVar1213 + auVar1471 + auVar598 * auVar1214;
  uVar1509 = auVar2._0_8_;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar594 * auVar1210 + auVar1470 + auVar595 * auVar1211 + auVar596 * auVar1212 +
           auVar599 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_248 = uVar1514 & 0xfffffffffffff;
  auVar1472._8_8_ = 0;
  auVar1472._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1510 & 0xfffffffffffff);
  auVar600._8_8_ = 0;
  auVar600._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1472 = auVar600 * ZEXT816(0x1000003d10) + auVar1472;
  uVar1509 = auVar1472._0_8_;
  uStack_240 = uVar1509 & 0xfffffffffffff;
  local_238 = (uVar1509 >> 0x34 | auVar1472._8_8_ << 0xc) + (uVar1518 & 0xffffffffffff);
  iVar1515 = 6;
  local_258 = uVar1508 & 0xfffffffffffff;
  uStack_250 = uVar1516 & 0xfffffffffffff;
  do {
    auVar601._8_8_ = 0;
    auVar601._0_8_ = local_258 * 2;
    auVar1215._8_8_ = 0;
    auVar1215._0_8_ = uStack_240;
    auVar602._8_8_ = 0;
    auVar602._0_8_ = uStack_250 * 2;
    auVar1216._8_8_ = 0;
    auVar1216._0_8_ = local_248;
    auVar603._8_8_ = 0;
    auVar603._0_8_ = local_238;
    auVar1217._8_8_ = 0;
    auVar1217._0_8_ = local_238;
    uVar1509 = SUB168(auVar603 * auVar1217,0);
    auVar604._8_8_ = 0;
    auVar604._0_8_ = uVar1509 & 0xfffffffffffff;
    auVar1 = auVar602 * auVar1216 + auVar601 * auVar1215 + auVar604 * ZEXT816(0x1000003d10);
    uVar1518 = auVar1._0_8_;
    auVar1473._8_8_ = 0;
    auVar1473._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
    local_238 = local_238 * 2;
    auVar605._8_8_ = 0;
    auVar605._0_8_ = local_258;
    auVar1218._8_8_ = 0;
    auVar1218._0_8_ = local_238;
    auVar606._8_8_ = 0;
    auVar606._0_8_ = uStack_250 * 2;
    auVar1219._8_8_ = 0;
    auVar1219._0_8_ = uStack_240;
    auVar607._8_8_ = 0;
    auVar607._0_8_ = local_248;
    auVar1220._8_8_ = 0;
    auVar1220._0_8_ = local_248;
    auVar608._8_8_ = 0;
    auVar608._0_8_ = uVar1509 >> 0x34 | SUB168(auVar603 * auVar1217,8) << 0xc;
    auVar1 = auVar605 * auVar1218 + auVar1473 + auVar606 * auVar1219 + auVar607 * auVar1220 +
             auVar608 * ZEXT816(0x1000003d10);
    uVar1510 = auVar1._0_8_;
    auVar1474._8_8_ = 0;
    auVar1474._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar609._8_8_ = 0;
    auVar609._0_8_ = local_258;
    auVar1221._8_8_ = 0;
    auVar1221._0_8_ = local_258;
    auVar610._8_8_ = 0;
    auVar610._0_8_ = uStack_250;
    auVar1222._8_8_ = 0;
    auVar1222._0_8_ = local_238;
    auVar611._8_8_ = 0;
    auVar611._0_8_ = local_248 * 2;
    auVar1223._8_8_ = 0;
    auVar1223._0_8_ = uStack_240;
    auVar1 = auVar610 * auVar1222 + auVar1474 + auVar611 * auVar1223;
    uVar1509 = auVar1._0_8_;
    auVar1476._8_8_ = 0;
    auVar1476._0_8_ = uVar1509 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar1224._8_8_ = 0;
    auVar1224._0_8_ = (uVar1509 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
    auVar1 = auVar609 * auVar1221 + ZEXT816(0x1000003d1) * auVar1224;
    uVar1514 = auVar1._0_8_;
    uVar1509 = uVar1514 & 0xfffffffffffff;
    auVar1475._8_8_ = 0;
    auVar1475._0_8_ = uVar1514 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar612._8_8_ = 0;
    auVar612._0_8_ = local_258 * 2;
    auVar1225._8_8_ = 0;
    auVar1225._0_8_ = uStack_250;
    auVar613._8_8_ = 0;
    auVar613._0_8_ = local_248;
    auVar1226._8_8_ = 0;
    auVar1226._0_8_ = local_238;
    auVar614._8_8_ = 0;
    auVar614._0_8_ = uStack_240;
    auVar1227._8_8_ = 0;
    auVar1227._0_8_ = uStack_240;
    auVar2 = auVar613 * auVar1226 + auVar1476 + auVar614 * auVar1227;
    uVar1514 = auVar2._0_8_;
    auVar615._8_8_ = 0;
    auVar615._0_8_ = uVar1514 & 0xfffffffffffff;
    auVar1 = auVar612 * auVar1225 + auVar1475 + auVar615 * ZEXT816(0x1000003d10);
    uVar1511 = auVar1._0_8_;
    auVar1478._8_8_ = 0;
    auVar1478._0_8_ = uVar1514 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1514 = uVar1511 & 0xfffffffffffff;
    auVar1477._8_8_ = 0;
    auVar1477._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
    auVar616._8_8_ = 0;
    auVar616._0_8_ = local_258 * 2;
    auVar1228._8_8_ = 0;
    auVar1228._0_8_ = local_248;
    auVar617._8_8_ = 0;
    auVar617._0_8_ = uStack_250;
    auVar1229._8_8_ = 0;
    auVar1229._0_8_ = uStack_250;
    auVar618._8_8_ = 0;
    auVar618._0_8_ = uStack_240;
    auVar1230._8_8_ = 0;
    auVar1230._0_8_ = local_238;
    auVar1478 = auVar618 * auVar1230 + auVar1478;
    uVar1511 = auVar1478._0_8_;
    auVar619._8_8_ = 0;
    auVar619._0_8_ = uVar1511 & 0xfffffffffffff;
    auVar1 = auVar616 * auVar1228 + auVar1477 + auVar617 * auVar1229 +
             auVar619 * ZEXT816(0x1000003d10);
    uVar1508 = auVar1._0_8_;
    local_248 = uVar1508 & 0xfffffffffffff;
    auVar1479._8_8_ = 0;
    auVar1479._0_8_ = (uVar1508 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1518 & 0xfffffffffffff);
    auVar620._8_8_ = 0;
    auVar620._0_8_ = uVar1511 >> 0x34 | auVar1478._8_8_ << 0xc;
    auVar1479 = auVar620 * ZEXT816(0x1000003d10) + auVar1479;
    uVar1518 = auVar1479._0_8_;
    uStack_240 = uVar1518 & 0xfffffffffffff;
    local_238 = (uVar1518 >> 0x34 | auVar1479._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
    iVar1515 = iVar1515 + -1;
    local_258 = uVar1509;
    uStack_250 = uVar1514;
  } while (iVar1515 != 0);
  auVar621._8_8_ = 0;
  auVar621._0_8_ = local_58;
  auVar1231._8_8_ = 0;
  auVar1231._0_8_ = uStack_240;
  auVar622._8_8_ = 0;
  auVar622._0_8_ = local_50;
  auVar1232._8_8_ = 0;
  auVar1232._0_8_ = local_248;
  auVar623._8_8_ = 0;
  auVar623._0_8_ = local_48;
  auVar1233._8_8_ = 0;
  auVar1233._0_8_ = uVar1514;
  auVar624._8_8_ = 0;
  auVar624._0_8_ = local_40;
  auVar1234._8_8_ = 0;
  auVar1234._0_8_ = uVar1509;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = local_38;
  auVar1235._8_8_ = 0;
  auVar1235._0_8_ = local_238;
  uVar1518 = SUB168(auVar625 * auVar1235,0);
  auVar626._8_8_ = 0;
  auVar626._0_8_ = uVar1518 & 0xfffffffffffff;
  auVar1 = auVar622 * auVar1232 + auVar621 * auVar1231 + auVar623 * auVar1233 + auVar624 * auVar1234
           + auVar626 * ZEXT816(0x1000003d10);
  uVar1511 = auVar1._0_8_;
  auVar1480._8_8_ = 0;
  auVar1480._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar627._8_8_ = 0;
  auVar627._0_8_ = local_58;
  auVar1236._8_8_ = 0;
  auVar1236._0_8_ = local_238;
  auVar628._8_8_ = 0;
  auVar628._0_8_ = local_50;
  auVar1237._8_8_ = 0;
  auVar1237._0_8_ = uStack_240;
  auVar629._8_8_ = 0;
  auVar629._0_8_ = local_48;
  auVar1238._8_8_ = 0;
  auVar1238._0_8_ = local_248;
  auVar630._8_8_ = 0;
  auVar630._0_8_ = local_40;
  auVar1239._8_8_ = 0;
  auVar1239._0_8_ = uVar1514;
  auVar631._8_8_ = 0;
  auVar631._0_8_ = local_38;
  auVar1240._8_8_ = 0;
  auVar1240._0_8_ = uVar1509;
  auVar632._8_8_ = 0;
  auVar632._0_8_ = uVar1518 >> 0x34 | SUB168(auVar625 * auVar1235,8) << 0xc;
  auVar1 = auVar627 * auVar1236 + auVar1480 + auVar628 * auVar1237 + auVar629 * auVar1238 +
           auVar630 * auVar1239 + auVar631 * auVar1240 + auVar632 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1481._8_8_ = 0;
  auVar1481._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar633._8_8_ = 0;
  auVar633._0_8_ = local_58;
  auVar1241._8_8_ = 0;
  auVar1241._0_8_ = uVar1509;
  auVar634._8_8_ = 0;
  auVar634._0_8_ = local_50;
  auVar1242._8_8_ = 0;
  auVar1242._0_8_ = local_238;
  auVar635._8_8_ = 0;
  auVar635._0_8_ = local_48;
  auVar1243._8_8_ = 0;
  auVar1243._0_8_ = uStack_240;
  auVar636._8_8_ = 0;
  auVar636._0_8_ = local_40;
  auVar1244._8_8_ = 0;
  auVar1244._0_8_ = local_248;
  auVar637._8_8_ = 0;
  auVar637._0_8_ = local_38;
  auVar1245._8_8_ = 0;
  auVar1245._0_8_ = uVar1514;
  auVar1 = auVar634 * auVar1242 + auVar1481 + auVar635 * auVar1243 + auVar636 * auVar1244 +
           auVar637 * auVar1245;
  uVar1518 = auVar1._0_8_;
  auVar1483._8_8_ = 0;
  auVar1483._0_8_ = uVar1518 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1246._8_8_ = 0;
  auVar1246._0_8_ = (uVar1518 & 0xfffffffffffff) << 4 | (uVar1508 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar633 * auVar1241 + ZEXT816(0x1000003d1) * auVar1246;
  uVar1510 = auVar1._0_8_;
  uVar1518 = uVar1510 & 0xfffffffffffff;
  auVar1482._8_8_ = 0;
  auVar1482._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar638._8_8_ = 0;
  auVar638._0_8_ = local_58;
  auVar1247._8_8_ = 0;
  auVar1247._0_8_ = uVar1514;
  auVar639._8_8_ = 0;
  auVar639._0_8_ = local_50;
  auVar1248._8_8_ = 0;
  auVar1248._0_8_ = uVar1509;
  auVar640._8_8_ = 0;
  auVar640._0_8_ = local_48;
  auVar1249._8_8_ = 0;
  auVar1249._0_8_ = local_238;
  auVar641._8_8_ = 0;
  auVar641._0_8_ = local_40;
  auVar1250._8_8_ = 0;
  auVar1250._0_8_ = uStack_240;
  auVar642._8_8_ = 0;
  auVar642._0_8_ = local_38;
  auVar1251._8_8_ = 0;
  auVar1251._0_8_ = local_248;
  auVar2 = auVar640 * auVar1249 + auVar1483 + auVar641 * auVar1250 + auVar642 * auVar1251;
  uVar1510 = auVar2._0_8_;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = uVar1510 & 0xfffffffffffff;
  auVar1 = auVar638 * auVar1247 + auVar1482 + auVar639 * auVar1248 +
           auVar643 * ZEXT816(0x1000003d10);
  uVar1516 = auVar1._0_8_;
  auVar1485._8_8_ = 0;
  auVar1485._0_8_ = uVar1510 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1510 = uVar1516 & 0xfffffffffffff;
  auVar1484._8_8_ = 0;
  auVar1484._0_8_ = uVar1516 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar644._8_8_ = 0;
  auVar644._0_8_ = local_58;
  auVar1252._8_8_ = 0;
  auVar1252._0_8_ = local_248;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = local_50;
  auVar1253._8_8_ = 0;
  auVar1253._0_8_ = uVar1514;
  auVar646._8_8_ = 0;
  auVar646._0_8_ = local_48;
  auVar1254._8_8_ = 0;
  auVar1254._0_8_ = uVar1509;
  auVar647._8_8_ = 0;
  auVar647._0_8_ = local_40;
  auVar1255._8_8_ = 0;
  auVar1255._0_8_ = local_238;
  auVar648._8_8_ = 0;
  auVar648._0_8_ = local_38;
  auVar1256._8_8_ = 0;
  auVar1256._0_8_ = uStack_240;
  auVar2 = auVar647 * auVar1255 + auVar1485 + auVar648 * auVar1256;
  uVar1509 = auVar2._0_8_;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar644 * auVar1252 + auVar1484 + auVar645 * auVar1253 + auVar646 * auVar1254 +
           auVar649 * ZEXT816(0x1000003d10);
  uVar1516 = auVar1._0_8_;
  uVar1514 = uVar1516 & 0xfffffffffffff;
  auVar1486._8_8_ = 0;
  auVar1486._0_8_ = (uVar1516 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1511 & 0xfffffffffffff);
  auVar650._8_8_ = 0;
  auVar650._0_8_ = uVar1509 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar1486 = auVar650 * ZEXT816(0x1000003d10) + auVar1486;
  uVar1509 = auVar1486._0_8_;
  uVar1511 = uVar1509 & 0xfffffffffffff;
  uVar1509 = (uVar1509 >> 0x34 | auVar1486._8_8_ << 0xc) + (uVar1508 & 0xffffffffffff);
  auVar651._8_8_ = 0;
  auVar651._0_8_ = uVar1518 * 2;
  auVar1257._8_8_ = 0;
  auVar1257._0_8_ = uVar1511;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = uVar1510 * 2;
  auVar1258._8_8_ = 0;
  auVar1258._0_8_ = uVar1514;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = uVar1509;
  auVar1259._8_8_ = 0;
  auVar1259._0_8_ = uVar1509;
  uVar1508 = SUB168(auVar653 * auVar1259,0);
  auVar654._8_8_ = 0;
  auVar654._0_8_ = uVar1508 & 0xfffffffffffff;
  auVar1 = auVar652 * auVar1258 + auVar651 * auVar1257 + auVar654 * ZEXT816(0x1000003d10);
  uVar1512 = auVar1._0_8_;
  auVar1487._8_8_ = 0;
  auVar1487._0_8_ = uVar1512 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1509 = uVar1509 * 2;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = uVar1518;
  auVar1260._8_8_ = 0;
  auVar1260._0_8_ = uVar1509;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = uVar1510 * 2;
  auVar1261._8_8_ = 0;
  auVar1261._0_8_ = uVar1511;
  auVar657._8_8_ = 0;
  auVar657._0_8_ = uVar1514;
  auVar1262._8_8_ = 0;
  auVar1262._0_8_ = uVar1514;
  auVar658._8_8_ = 0;
  auVar658._0_8_ = uVar1508 >> 0x34 | SUB168(auVar653 * auVar1259,8) << 0xc;
  auVar1 = auVar655 * auVar1260 + auVar1487 + auVar656 * auVar1261 + auVar657 * auVar1262 +
           auVar658 * ZEXT816(0x1000003d10);
  uVar1513 = auVar1._0_8_;
  auVar1488._8_8_ = 0;
  auVar1488._0_8_ = uVar1513 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = uVar1518;
  auVar1263._8_8_ = 0;
  auVar1263._0_8_ = uVar1518;
  auVar660._8_8_ = 0;
  auVar660._0_8_ = uVar1510;
  auVar1264._8_8_ = 0;
  auVar1264._0_8_ = uVar1509;
  auVar661._8_8_ = 0;
  auVar661._0_8_ = uVar1514 * 2;
  auVar1265._8_8_ = 0;
  auVar1265._0_8_ = uVar1511;
  auVar1 = auVar660 * auVar1264 + auVar1488 + auVar661 * auVar1265;
  uVar1508 = auVar1._0_8_;
  auVar1490._8_8_ = 0;
  auVar1490._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1266._8_8_ = 0;
  auVar1266._0_8_ = (uVar1508 & 0xfffffffffffff) << 4 | (uVar1513 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar659 * auVar1263 + ZEXT816(0x1000003d1) * auVar1266;
  uVar1516 = auVar1._0_8_;
  uVar1508 = uVar1516 & 0xfffffffffffff;
  auVar1489._8_8_ = 0;
  auVar1489._0_8_ = uVar1516 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar662._8_8_ = 0;
  auVar662._0_8_ = uVar1518 * 2;
  auVar1267._8_8_ = 0;
  auVar1267._0_8_ = uVar1510;
  auVar663._8_8_ = 0;
  auVar663._0_8_ = uVar1514;
  auVar1268._8_8_ = 0;
  auVar1268._0_8_ = uVar1509;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = uVar1511;
  auVar1269._8_8_ = 0;
  auVar1269._0_8_ = uVar1511;
  auVar2 = auVar663 * auVar1268 + auVar1490 + auVar664 * auVar1269;
  uVar1516 = auVar2._0_8_;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = uVar1516 & 0xfffffffffffff;
  auVar1 = auVar662 * auVar1267 + auVar1489 + auVar665 * ZEXT816(0x1000003d10);
  uVar1517 = auVar1._0_8_;
  auVar1492._8_8_ = 0;
  auVar1492._0_8_ = uVar1516 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1516 = uVar1517 & 0xfffffffffffff;
  auVar1491._8_8_ = 0;
  auVar1491._0_8_ = uVar1517 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar666._8_8_ = 0;
  auVar666._0_8_ = uVar1518 * 2;
  auVar1270._8_8_ = 0;
  auVar1270._0_8_ = uVar1514;
  auVar667._8_8_ = 0;
  auVar667._0_8_ = uVar1510;
  auVar1271._8_8_ = 0;
  auVar1271._0_8_ = uVar1510;
  auVar668._8_8_ = 0;
  auVar668._0_8_ = uVar1511;
  auVar1272._8_8_ = 0;
  auVar1272._0_8_ = uVar1509;
  auVar1492 = auVar668 * auVar1272 + auVar1492;
  uVar1509 = auVar1492._0_8_;
  auVar669._8_8_ = 0;
  auVar669._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar666 * auVar1270 + auVar1491 + auVar667 * auVar1271 +
           auVar669 * ZEXT816(0x1000003d10);
  uVar1518 = auVar1._0_8_;
  uVar1514 = uVar1518 & 0xfffffffffffff;
  auVar1493._8_8_ = 0;
  auVar1493._0_8_ = (uVar1518 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1512 & 0xfffffffffffff);
  auVar670._8_8_ = 0;
  auVar670._0_8_ = uVar1509 >> 0x34 | auVar1492._8_8_ << 0xc;
  auVar1493 = auVar670 * ZEXT816(0x1000003d10) + auVar1493;
  uVar1509 = auVar1493._0_8_;
  uVar1518 = uVar1509 & 0xfffffffffffff;
  uVar1509 = (uVar1509 >> 0x34 | auVar1493._8_8_ << 0xc) + (uVar1513 & 0xffffffffffff);
  auVar671._8_8_ = 0;
  auVar671._0_8_ = uVar1508 * 2;
  auVar1273._8_8_ = 0;
  auVar1273._0_8_ = uVar1518;
  auVar672._8_8_ = 0;
  auVar672._0_8_ = uVar1516 * 2;
  auVar1274._8_8_ = 0;
  auVar1274._0_8_ = uVar1514;
  auVar673._8_8_ = 0;
  auVar673._0_8_ = uVar1509;
  auVar1275._8_8_ = 0;
  auVar1275._0_8_ = uVar1509;
  uVar1510 = SUB168(auVar673 * auVar1275,0);
  auVar674._8_8_ = 0;
  auVar674._0_8_ = uVar1510 & 0xfffffffffffff;
  auVar1 = auVar672 * auVar1274 + auVar671 * auVar1273 + auVar674 * ZEXT816(0x1000003d10);
  uVar1511 = auVar1._0_8_;
  auVar1494._8_8_ = 0;
  auVar1494._0_8_ = uVar1511 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1509 = uVar1509 * 2;
  auVar675._8_8_ = 0;
  auVar675._0_8_ = uVar1508;
  auVar1276._8_8_ = 0;
  auVar1276._0_8_ = uVar1509;
  auVar676._8_8_ = 0;
  auVar676._0_8_ = uVar1516 * 2;
  auVar1277._8_8_ = 0;
  auVar1277._0_8_ = uVar1518;
  auVar677._8_8_ = 0;
  auVar677._0_8_ = uVar1514;
  auVar1278._8_8_ = 0;
  auVar1278._0_8_ = uVar1514;
  auVar678._8_8_ = 0;
  auVar678._0_8_ = uVar1510 >> 0x34 | SUB168(auVar673 * auVar1275,8) << 0xc;
  auVar1 = auVar675 * auVar1276 + auVar1494 + auVar676 * auVar1277 + auVar677 * auVar1278 +
           auVar678 * ZEXT816(0x1000003d10);
  uVar1510 = auVar1._0_8_;
  auVar1495._8_8_ = 0;
  auVar1495._0_8_ = uVar1510 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar679._8_8_ = 0;
  auVar679._0_8_ = uVar1508;
  auVar1279._8_8_ = 0;
  auVar1279._0_8_ = uVar1508;
  auVar680._8_8_ = 0;
  auVar680._0_8_ = uVar1516;
  auVar1280._8_8_ = 0;
  auVar1280._0_8_ = uVar1509;
  auVar681._8_8_ = 0;
  auVar681._0_8_ = uVar1514 * 2;
  auVar1281._8_8_ = 0;
  auVar1281._0_8_ = uVar1518;
  auVar1 = auVar680 * auVar1280 + auVar1495 + auVar681 * auVar1281;
  uVar1512 = auVar1._0_8_;
  auVar1497._8_8_ = 0;
  auVar1497._0_8_ = uVar1512 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1282._8_8_ = 0;
  auVar1282._0_8_ = (uVar1512 & 0xfffffffffffff) << 4 | (uVar1510 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar679 * auVar1279 + ZEXT816(0x1000003d1) * auVar1282;
  uVar1512 = auVar1._0_8_;
  r->n[0] = uVar1512 & 0xfffffffffffff;
  auVar1496._8_8_ = 0;
  auVar1496._0_8_ = uVar1512 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar682._8_8_ = 0;
  auVar682._0_8_ = uVar1508 * 2;
  auVar1283._8_8_ = 0;
  auVar1283._0_8_ = uVar1516;
  auVar683._8_8_ = 0;
  auVar683._0_8_ = uVar1514;
  auVar1284._8_8_ = 0;
  auVar1284._0_8_ = uVar1509;
  auVar684._8_8_ = 0;
  auVar684._0_8_ = uVar1518;
  auVar1285._8_8_ = 0;
  auVar1285._0_8_ = uVar1518;
  auVar2 = auVar683 * auVar1284 + auVar1497 + auVar684 * auVar1285;
  uVar1512 = auVar2._0_8_;
  auVar685._8_8_ = 0;
  auVar685._0_8_ = uVar1512 & 0xfffffffffffff;
  auVar1 = auVar682 * auVar1283 + auVar1496 + auVar685 * ZEXT816(0x1000003d10);
  uVar1513 = auVar1._0_8_;
  auVar1499._8_8_ = 0;
  auVar1499._0_8_ = uVar1512 >> 0x34 | auVar2._8_8_ << 0xc;
  r->n[1] = uVar1513 & 0xfffffffffffff;
  auVar1498._8_8_ = 0;
  auVar1498._0_8_ = uVar1513 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar686._8_8_ = 0;
  auVar686._0_8_ = uVar1508 * 2;
  auVar1286._8_8_ = 0;
  auVar1286._0_8_ = uVar1514;
  auVar687._8_8_ = 0;
  auVar687._0_8_ = uVar1516;
  auVar1287._8_8_ = 0;
  auVar1287._0_8_ = uVar1516;
  auVar688._8_8_ = 0;
  auVar688._0_8_ = uVar1518;
  auVar1288._8_8_ = 0;
  auVar1288._0_8_ = uVar1509;
  auVar1499 = auVar688 * auVar1288 + auVar1499;
  uVar1509 = auVar1499._0_8_;
  auVar689._8_8_ = 0;
  auVar689._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar686 * auVar1286 + auVar1498 + auVar687 * auVar1287 +
           auVar689 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  r->n[2] = uVar1514 & 0xfffffffffffff;
  auVar1500._8_8_ = 0;
  auVar1500._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1511 & 0xfffffffffffff);
  auVar690._8_8_ = 0;
  auVar690._0_8_ = uVar1509 >> 0x34 | auVar1499._8_8_ << 0xc;
  auVar1500 = auVar690 * ZEXT816(0x1000003d10) + auVar1500;
  uVar1509 = auVar1500._0_8_;
  r->n[3] = uVar1509 & 0xfffffffffffff;
  r->n[4] = (uVar1509 >> 0x34 | auVar1500._8_8_ << 0xc) + (uVar1510 & 0xffffffffffff);
  uVar1509 = r->n[0];
  uVar1514 = r->n[1];
  uVar1518 = r->n[2];
  uVar1510 = r->n[3];
  uVar1511 = r->n[4];
  auVar691._8_8_ = 0;
  auVar691._0_8_ = uVar1509 * 2;
  auVar1289._8_8_ = 0;
  auVar1289._0_8_ = uVar1510;
  auVar692._8_8_ = 0;
  auVar692._0_8_ = uVar1514 * 2;
  auVar1290._8_8_ = 0;
  auVar1290._0_8_ = uVar1518;
  auVar693._8_8_ = 0;
  auVar693._0_8_ = uVar1511;
  auVar1291._8_8_ = 0;
  auVar1291._0_8_ = uVar1511;
  uVar1508 = SUB168(auVar693 * auVar1291,0);
  auVar694._8_8_ = 0;
  auVar694._0_8_ = uVar1508 & 0xfffffffffffff;
  auVar1 = auVar692 * auVar1290 + auVar691 * auVar1289 + auVar694 * ZEXT816(0x1000003d10);
  uVar1516 = auVar1._0_8_;
  auVar1501._8_8_ = 0;
  auVar1501._0_8_ = uVar1516 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar1511 = uVar1511 * 2;
  auVar695._8_8_ = 0;
  auVar695._0_8_ = uVar1509;
  auVar1292._8_8_ = 0;
  auVar1292._0_8_ = uVar1511;
  auVar696._8_8_ = 0;
  auVar696._0_8_ = uVar1514 * 2;
  auVar1293._8_8_ = 0;
  auVar1293._0_8_ = uVar1510;
  auVar697._8_8_ = 0;
  auVar697._0_8_ = uVar1518;
  auVar1294._8_8_ = 0;
  auVar1294._0_8_ = uVar1518;
  auVar698._8_8_ = 0;
  auVar698._0_8_ = uVar1508 >> 0x34 | SUB168(auVar693 * auVar1291,8) << 0xc;
  auVar1 = auVar695 * auVar1292 + auVar1501 + auVar696 * auVar1293 + auVar697 * auVar1294 +
           auVar698 * ZEXT816(0x1000003d10);
  uVar1508 = auVar1._0_8_;
  auVar1502._8_8_ = 0;
  auVar1502._0_8_ = uVar1508 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar699._8_8_ = 0;
  auVar699._0_8_ = uVar1509;
  auVar1295._8_8_ = 0;
  auVar1295._0_8_ = uVar1509;
  auVar700._8_8_ = 0;
  auVar700._0_8_ = uVar1514;
  auVar1296._8_8_ = 0;
  auVar1296._0_8_ = uVar1511;
  auVar701._8_8_ = 0;
  auVar701._0_8_ = uVar1518 * 2;
  auVar1297._8_8_ = 0;
  auVar1297._0_8_ = uVar1510;
  auVar1 = auVar700 * auVar1296 + auVar1502 + auVar701 * auVar1297;
  uVar1512 = auVar1._0_8_;
  auVar1504._8_8_ = 0;
  auVar1504._0_8_ = uVar1512 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar1298._8_8_ = 0;
  auVar1298._0_8_ = (uVar1512 & 0xfffffffffffff) << 4 | (uVar1508 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar699 * auVar1295 + ZEXT816(0x1000003d1) * auVar1298;
  uVar1512 = auVar1._0_8_;
  local_258 = uVar1512 & 0xfffffffffffff;
  auVar1503._8_8_ = 0;
  auVar1503._0_8_ = uVar1512 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar702._8_8_ = 0;
  auVar702._0_8_ = uVar1509 * 2;
  auVar1299._8_8_ = 0;
  auVar1299._0_8_ = uVar1514;
  auVar703._8_8_ = 0;
  auVar703._0_8_ = uVar1518;
  auVar1300._8_8_ = 0;
  auVar1300._0_8_ = uVar1511;
  auVar704._8_8_ = 0;
  auVar704._0_8_ = uVar1510;
  auVar1301._8_8_ = 0;
  auVar1301._0_8_ = uVar1510;
  auVar2 = auVar703 * auVar1300 + auVar1504 + auVar704 * auVar1301;
  uVar1512 = auVar2._0_8_;
  auVar705._8_8_ = 0;
  auVar705._0_8_ = uVar1512 & 0xfffffffffffff;
  auVar1 = auVar702 * auVar1299 + auVar1503 + auVar705 * ZEXT816(0x1000003d10);
  uVar1513 = auVar1._0_8_;
  auVar1506._8_8_ = 0;
  auVar1506._0_8_ = uVar1512 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_250 = uVar1513 & 0xfffffffffffff;
  auVar1505._8_8_ = 0;
  auVar1505._0_8_ = uVar1513 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar706._8_8_ = 0;
  auVar706._0_8_ = uVar1509 * 2;
  auVar1302._8_8_ = 0;
  auVar1302._0_8_ = uVar1518;
  auVar707._8_8_ = 0;
  auVar707._0_8_ = uVar1514;
  auVar1303._8_8_ = 0;
  auVar1303._0_8_ = uVar1514;
  auVar708._8_8_ = 0;
  auVar708._0_8_ = uVar1510;
  auVar1304._8_8_ = 0;
  auVar1304._0_8_ = uVar1511;
  auVar1506 = auVar708 * auVar1304 + auVar1506;
  uVar1509 = auVar1506._0_8_;
  auVar709._8_8_ = 0;
  auVar709._0_8_ = uVar1509 & 0xfffffffffffff;
  auVar1 = auVar706 * auVar1302 + auVar1505 + auVar707 * auVar1303 +
           auVar709 * ZEXT816(0x1000003d10);
  uVar1514 = auVar1._0_8_;
  local_248 = uVar1514 & 0xfffffffffffff;
  auVar1507._8_8_ = 0;
  auVar1507._0_8_ = (uVar1514 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar1516 & 0xfffffffffffff);
  auVar710._8_8_ = 0;
  auVar710._0_8_ = uVar1509 >> 0x34 | auVar1506._8_8_ << 0xc;
  auVar1507 = auVar710 * ZEXT816(0x1000003d10) + auVar1507;
  uVar1509 = auVar1507._0_8_;
  uStack_240 = uVar1509 & 0xfffffffffffff;
  local_238 = (uVar1509 >> 0x34 | auVar1507._8_8_ << 0xc) + (uVar1508 & 0xffffffffffff);
  local_288.n[0] = (0x3ffffbfffff0bc - local_258) + a->n[0];
  local_288.n[1] = (0x3ffffffffffffc - uStack_250) + a->n[1];
  local_288.n[2] = (0x3ffffffffffffc - local_248) + a->n[2];
  local_288.n[3] = (0x3ffffffffffffc - uStack_240) + a->n[3];
  local_288.n[4] = (0x3fffffffffffc - local_238) + a->n[4];
  local_260 = r;
  local_1d0 = a;
  iVar1515 = secp256k1_fe_normalizes_to_zero(&local_288);
  return iVar1515;
}

Assistant:

static int secp256k1_fe_sqrt(secp256k1_fe *r, const secp256k1_fe *a) {
    /** Given that p is congruent to 3 mod 4, we can compute the square root of
     *  a mod p as the (p+1)/4'th power of a.
     *
     *  As (p+1)/4 is an even number, it will have the same result for a and for
     *  (-a). Only one of these two numbers actually has a square root however,
     *  so we test at the end by squaring and comparing to the input.
     *  Also because (p+1)/4 is an even number, the computed square root is
     *  itself always a square (a ** ((p+1)/4) is the square of a ** ((p+1)/8)).
     */
    secp256k1_fe x2, x3, x6, x9, x11, x22, x44, x88, x176, x220, x223, t1;
    int j;

    VERIFY_CHECK(r != a);

    /** The binary representation of (p + 1)/4 has 3 blocks of 1s, with lengths in
     *  { 2, 22, 223 }. Use an addition chain to calculate 2^n - 1 for each block:
     *  1, [2], 3, 6, 9, 11, [22], 44, 88, 176, 220, [223]
     */

    secp256k1_fe_sqr(&x2, a);
    secp256k1_fe_mul(&x2, &x2, a);

    secp256k1_fe_sqr(&x3, &x2);
    secp256k1_fe_mul(&x3, &x3, a);

    x6 = x3;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x6, &x6);
    }
    secp256k1_fe_mul(&x6, &x6, &x3);

    x9 = x6;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x9, &x9);
    }
    secp256k1_fe_mul(&x9, &x9, &x3);

    x11 = x9;
    for (j=0; j<2; j++) {
        secp256k1_fe_sqr(&x11, &x11);
    }
    secp256k1_fe_mul(&x11, &x11, &x2);

    x22 = x11;
    for (j=0; j<11; j++) {
        secp256k1_fe_sqr(&x22, &x22);
    }
    secp256k1_fe_mul(&x22, &x22, &x11);

    x44 = x22;
    for (j=0; j<22; j++) {
        secp256k1_fe_sqr(&x44, &x44);
    }
    secp256k1_fe_mul(&x44, &x44, &x22);

    x88 = x44;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x88, &x88);
    }
    secp256k1_fe_mul(&x88, &x88, &x44);

    x176 = x88;
    for (j=0; j<88; j++) {
        secp256k1_fe_sqr(&x176, &x176);
    }
    secp256k1_fe_mul(&x176, &x176, &x88);

    x220 = x176;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x220, &x220);
    }
    secp256k1_fe_mul(&x220, &x220, &x44);

    x223 = x220;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x223, &x223);
    }
    secp256k1_fe_mul(&x223, &x223, &x3);

    /* The final result is then assembled using a sliding window over the blocks. */

    t1 = x223;
    for (j=0; j<23; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x22);
    for (j=0; j<6; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x2);
    secp256k1_fe_sqr(&t1, &t1);
    secp256k1_fe_sqr(r, &t1);

    /* Check that a square root was actually calculated */

    secp256k1_fe_sqr(&t1, r);
    return secp256k1_fe_equal(&t1, a);
}